

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1P3L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  double *pdVar1;
  double *this;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_00;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_01;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_02;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_03;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_04;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_05;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_06;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_07;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_08;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_09;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_10;
  Matrix<double,3,1,0,3,1> *other;
  Matrix<double,3,1,0,3,1> *this_11;
  Matrix<double,3,1,0,3,1> *other_00;
  Matrix<double,3,1,0,3,1> *this_12;
  Matrix<double,3,1,0,3,1> *other_01;
  Matrix<double,3,1,0,3,1> *this_13;
  Matrix<double,3,1,0,3,1> *other_02;
  Matrix<double,3,1,0,3,1> *this_14;
  Matrix<double,3,1,0,3,1> *other_03;
  Matrix<double,3,1,0,3,1> *this_15;
  Matrix<double,3,1,0,3,1> *other_04;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *this_16;
  Matrix<double,3,1,0,3,1> *this_17;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *pDVar2;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *pDVar3;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *this_18;
  pointer *this_19;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  size_type sVar89;
  ostream *this_20;
  reference pvVar90;
  reference pvVar91;
  Scalar *pSVar92;
  reference pvVar93;
  Scalar *pSVar94;
  Scalar *pSVar95;
  reference pvVar96;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  double dVar325;
  double dVar326;
  double dVar327;
  double dVar328;
  double dVar329;
  double dVar330;
  double dVar331;
  double dVar332;
  double dVar333;
  double dVar334;
  double dVar335;
  double dVar336;
  double dVar337;
  double dVar338;
  double dVar339;
  double dVar340;
  double dVar341;
  double dVar342;
  double dVar343;
  double dVar344;
  double dVar345;
  double dVar346;
  double dVar347;
  double dVar348;
  double dVar349;
  double dVar350;
  double dVar351;
  double dVar352;
  double dVar353;
  double dVar354;
  double dVar355;
  double dVar356;
  double dVar357;
  double dVar358;
  double dVar359;
  double dVar360;
  double dVar361;
  double dVar362;
  double dVar363;
  double dVar364;
  double dVar365;
  double dVar366;
  double dVar367;
  double dVar368;
  double dVar369;
  double dVar370;
  double dVar371;
  double dVar372;
  double dVar373;
  double dVar374;
  double dVar375;
  double dVar376;
  double dVar377;
  double dVar378;
  double dVar379;
  double dVar380;
  double dVar381;
  double dVar382;
  double dVar383;
  double dVar384;
  double dVar385;
  double dVar386;
  double dVar387;
  double dVar388;
  double dVar389;
  double dVar390;
  double dVar391;
  double dVar392;
  double dVar393;
  double dVar394;
  double dVar395;
  double dVar396;
  double dVar397;
  double dVar398;
  double dVar399;
  double dVar400;
  double dVar401;
  double dVar402;
  double dVar403;
  double dVar404;
  double dVar405;
  double dVar406;
  double dVar407;
  double dVar408;
  double dVar409;
  double dVar410;
  double dVar411;
  double dVar412;
  double dVar413;
  double dVar414;
  double dVar415;
  double dVar416;
  double dVar417;
  double dVar418;
  double dVar419;
  double dVar420;
  double dVar421;
  double dVar422;
  double dVar423;
  double dVar424;
  double dVar425;
  double dVar426;
  double dVar427;
  double dVar428;
  double dVar429;
  double dVar430;
  double dVar431;
  double dVar432;
  double dVar433;
  double dVar434;
  double dVar435;
  double dVar436;
  double dVar437;
  double dVar438;
  double dVar439;
  double dVar440;
  double dVar441;
  double dVar442;
  double dVar443;
  double dVar444;
  double dVar445;
  double dVar446;
  double dVar447;
  double dVar448;
  double dVar449;
  double dVar450;
  double dVar451;
  double dVar452;
  double dVar453;
  double dVar454;
  double dVar455;
  double dVar456;
  double dVar457;
  double dVar458;
  double dVar459;
  double dVar460;
  double dVar461;
  double dVar462;
  double dVar463;
  double dVar464;
  double dVar465;
  double dVar466;
  double dVar467;
  double dVar468;
  double dVar469;
  double dVar470;
  double dVar471;
  double dVar472;
  double dVar473;
  double dVar474;
  double dVar475;
  double dVar476;
  double dVar477;
  double dVar478;
  double dVar479;
  double dVar480;
  double dVar481;
  double dVar482;
  double dVar483;
  double dVar484;
  double dVar485;
  double dVar486;
  double dVar487;
  double dVar488;
  double dVar489;
  double dVar490;
  double dVar491;
  double dVar492;
  double dVar493;
  double dVar494;
  double dVar495;
  double dVar496;
  double dVar497;
  double dVar498;
  double dVar499;
  double dVar500;
  double dVar501;
  double dVar502;
  double dVar503;
  double dVar504;
  double dVar505;
  double dVar506;
  double dVar507;
  double dVar508;
  double dVar509;
  double dVar510;
  double dVar511;
  double dVar512;
  double dVar513;
  double dVar514;
  double dVar515;
  double dVar516;
  double dVar517;
  double dVar518;
  double dVar519;
  double dVar520;
  double dVar521;
  double dVar522;
  double dVar523;
  double dVar524;
  double dVar525;
  double dVar526;
  double dVar527;
  double dVar528;
  double dVar529;
  double dVar530;
  double dVar531;
  double dVar532;
  double dVar533;
  double dVar534;
  double dVar535;
  double dVar536;
  double dVar537;
  double dVar538;
  double dVar539;
  double dVar540;
  double dVar541;
  double dVar542;
  double dVar543;
  double dVar544;
  double dVar545;
  double dVar546;
  double dVar547;
  double dVar548;
  double dVar549;
  double dVar550;
  double dVar551;
  double dVar552;
  double dVar553;
  double dVar554;
  double dVar555;
  double dVar556;
  double dVar557;
  double dVar558;
  double dVar559;
  double dVar560;
  double dVar561;
  double dVar562;
  double dVar563;
  double dVar564;
  double dVar565;
  double dVar566;
  double dVar567;
  double dVar568;
  double dVar569;
  double dVar570;
  double dVar571;
  double dVar572;
  double dVar573;
  double dVar574;
  double dVar575;
  double dVar576;
  double dVar577;
  double dVar578;
  double dVar579;
  double dVar580;
  double dVar581;
  double dVar582;
  double dVar583;
  double dVar584;
  double dVar585;
  double dVar586;
  double dVar587;
  double dVar588;
  double dVar589;
  double dVar590;
  double dVar591;
  double dVar592;
  double dVar593;
  double dVar594;
  double dVar595;
  double dVar596;
  double dVar597;
  double dVar598;
  double dVar599;
  double dVar600;
  double dVar601;
  double dVar602;
  double dVar603;
  double dVar604;
  double dVar605;
  double dVar606;
  double dVar607;
  double dVar608;
  double dVar609;
  double dVar610;
  double dVar611;
  double dVar612;
  double dVar613;
  double dVar614;
  double dVar615;
  double dVar616;
  double dVar617;
  double dVar618;
  double dVar619;
  double dVar620;
  double dVar621;
  double dVar622;
  double dVar623;
  double dVar624;
  double dVar625;
  double dVar626;
  double dVar627;
  double dVar628;
  double dVar629;
  double dVar630;
  double dVar631;
  double dVar632;
  double dVar633;
  double dVar634;
  double dVar635;
  double dVar636;
  double dVar637;
  double dVar638;
  double dVar639;
  double dVar640;
  double dVar641;
  double dVar642;
  double dVar643;
  double dVar644;
  double dVar645;
  double dVar646;
  double dVar647;
  double dVar648;
  double dVar649;
  double dVar650;
  double dVar651;
  double dVar652;
  double dVar653;
  double dVar654;
  double dVar655;
  double dVar656;
  double dVar657;
  double dVar658;
  double dVar659;
  double dVar660;
  double dVar661;
  double dVar662;
  double dVar663;
  double dVar664;
  double dVar665;
  double dVar666;
  double dVar667;
  double dVar668;
  double dVar669;
  double dVar670;
  double dVar671;
  double dVar672;
  double dVar673;
  double dVar674;
  double dVar675;
  double dVar676;
  double dVar677;
  double dVar678;
  double dVar679;
  double dVar680;
  double dVar681;
  double dVar682;
  double dVar683;
  double dVar684;
  double dVar685;
  double dVar686;
  double dVar687;
  double dVar688;
  double dVar689;
  double dVar690;
  double dVar691;
  double dVar692;
  double dVar693;
  double dVar694;
  double dVar695;
  double dVar696;
  double dVar697;
  double dVar698;
  double dVar699;
  double dVar700;
  double dVar701;
  double dVar702;
  double dVar703;
  double dVar704;
  double dVar705;
  double dVar706;
  double dVar707;
  double dVar708;
  double dVar709;
  double dVar710;
  double dVar711;
  double dVar712;
  double dVar713;
  double dVar714;
  double dVar715;
  double dVar716;
  double dVar717;
  double dVar718;
  double dVar719;
  double dVar720;
  double dVar721;
  double dVar722;
  double dVar723;
  double dVar724;
  double dVar725;
  double dVar726;
  double dVar727;
  double dVar728;
  double dVar729;
  double dVar730;
  double dVar731;
  double dVar732;
  double dVar733;
  double dVar734;
  double dVar735;
  double dVar736;
  double dVar737;
  double dVar738;
  double dVar739;
  double dVar740;
  double dVar741;
  double dVar742;
  double dVar743;
  double dVar744;
  double dVar745;
  double dVar746;
  double dVar747;
  double dVar748;
  double dVar749;
  double dVar750;
  double dVar751;
  double dVar752;
  double dVar753;
  double dVar754;
  double dVar755;
  double dVar756;
  double dVar757;
  double dVar758;
  double dVar759;
  double dVar760;
  double dVar761;
  double dVar762;
  double dVar763;
  double dVar764;
  double dVar765;
  double dVar766;
  double dVar767;
  double dVar768;
  double dVar769;
  double dVar770;
  double dVar771;
  double dVar772;
  double dVar773;
  double dVar774;
  double dVar775;
  double dVar776;
  double dVar777;
  double dVar778;
  double dVar779;
  double dVar780;
  double dVar781;
  double dVar782;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> PVar783;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  PVar784;
  XprTypeNested local_1e50;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1e48;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1e38;
  Scalar local_1e20;
  Scalar local_1e18;
  Scalar local_1e10;
  Scalar local_1e08;
  Scalar local_1e00;
  Scalar local_1df8;
  Scalar local_1df0;
  Scalar local_1de8;
  Scalar local_1de0;
  Scalar local_1dd8;
  double local_1dd0;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_1dc8;
  uint local_1da4;
  uint local_1da0;
  uint iter;
  uint numSolutions;
  Matrix<double,_4,_4,_0,_4,_4> transOut;
  double shouldBeZero2;
  double shouldBeZero1;
  double b;
  double a;
  double ty;
  double tx;
  double sTheta2;
  double sTheta1;
  double s;
  vector<double,_std::allocator<double>_> realRoots;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  double c5;
  double c4;
  double c3;
  double c2;
  double c1;
  RhsNested local_1c60;
  double local_1c58;
  double v36;
  double v35;
  double v34;
  double v33;
  double v32;
  double v31;
  Matrix<double,_6,_1,_0,_6,_1> v3;
  double u36;
  double u35;
  double u34;
  double u33;
  double u32;
  double u31;
  Matrix<double,_6,_1,_0,_6,_1> u3;
  double v26;
  double v25;
  double v24;
  double v23;
  double v22;
  double v21;
  Matrix<double,_6,_1,_0,_6,_1> v2;
  double u26;
  double u25;
  double u24;
  double u23;
  double u22;
  double u21;
  Matrix<double,_6,_1,_0,_6,_1> u2;
  double v16;
  double v15;
  double v14;
  double v13;
  double v12;
  double v11;
  Matrix<double,_6,_1,_0,_6,_1> v1;
  double u16;
  double u15;
  double u14;
  double u13;
  double u12;
  double u11;
  Matrix<double,_6,_1,_0,_6,_1> u1;
  Type local_1990;
  ColXpr local_1958;
  Type local_1928;
  Matrix<double,_3,_1,_0,_3,_1> local_18c8;
  Matrix<double,_3,_3,_0,_3,_3> local_18b0;
  int local_1864;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_1860;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_1838;
  Type local_17d8;
  Type local_17a0;
  Type local_1768;
  Type local_1730;
  ConstantReturnType local_16f8;
  Type local_16e8;
  Type local_16b0;
  ColXpr local_1678;
  Type local_1648;
  Matrix<double,_3,_1,_0,_3,_1> local_15e8;
  Matrix<double,_3,_3,_0,_3,_3> local_15d0;
  int local_1584;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_1580;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_1558;
  Type local_14f8;
  Type local_14c0;
  Type local_1488;
  Type local_1450;
  ConstantReturnType local_1418;
  undefined1 local_1408 [8];
  Matrix<double,_6,_6,_0,_6,_6> TK;
  Matrix<double,_6,_6,_0,_6,_6> TL;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  undefined1 local_1138 [8];
  Matrix<double,_4,_4,_0,_4,_4> TV;
  Matrix<double,_4,_1,_0,_4,_1> local_1098;
  undefined1 local_1070 [8];
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  predTrans;
  RealScalar local_1020;
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_1018 [56];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_fe0 [24];
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_fc8 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_f90;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> local_f78 [56];
  RealScalar local_f40;
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_f38 [56];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_f00 [24];
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_ee8 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_eb0;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> local_e98 [56];
  RealScalar local_e60;
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_e58 [56];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_e20 [24];
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_e08 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_dd0;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_db8 [8];
  Matrix<double,_6,_1,_0,_6,_1> L32;
  Matrix<double,_6,_1,_0,_6,_1> L22;
  Matrix<double,_6,_1,_0,_6,_1> L12;
  RealScalar local_cf0;
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_ce8 [56];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_cb0 [24];
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_c98 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_c60;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> local_c48 [56];
  RealScalar local_c10;
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_c08 [56];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_bd0 [24];
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_bb8 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_b80;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> local_b68 [56];
  RealScalar local_b30;
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_b28 [56];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_af0 [24];
  Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false> local_ad8 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_aa0;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_a88 [8];
  Matrix<double,_6,_1,_0,_6,_1> L31;
  Matrix<double,_6,_1,_0,_6,_1> L21;
  Matrix<double,_6,_1,_0,_6,_1> L11;
  Matrix<double,_3,_1,_0,_3,_1> D1;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_9a8;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_950 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_918;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_8c0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_888;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_830 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_7f8;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_7a0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_768;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_710 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_6d8;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_680 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_648;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_5f0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_5b8;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_560 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_528;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_4d0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_498;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_440 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_408;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_3b0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>
  local_378;
  Matrix<double,3,1,0,3,1> local_320 [8];
  Matrix<double,_3,_1,_0,_3,_1> tQ32;
  Matrix<double,_3,_1,_0,_3,_1> tQ31;
  Matrix<double,_3,_1,_0,_3,_1> tP32;
  Matrix<double,_3,_1,_0,_3,_1> tP31;
  Matrix<double,_3,_1,_0,_3,_1> tQ22;
  Matrix<double,_3,_1,_0,_3,_1> tQ21;
  Matrix<double,_3,_1,_0,_3,_1> tP22;
  Matrix<double,_3,_1,_0,_3,_1> tP21;
  Matrix<double,_3,_1,_0,_3,_1> tQ12;
  Matrix<double,_3,_1,_0,_3,_1> tQ11;
  Matrix<double,_3,_1,_0,_3,_1> tP12;
  Matrix<double,_3,_1,_0,_3,_1> tP11;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_1f8 [7];
  bool verbose;
  Matrix<double,_4,_1,_0,_4,_1> Q32;
  Matrix<double,_4,_1,_0,_4,_1> Q31;
  Matrix<double,_4,_1,_0,_4,_1> P32;
  Matrix<double,_4,_1,_0,_4,_1> P31;
  Matrix<double,_4,_1,_0,_4,_1> Q22;
  Matrix<double,_4,_1,_0,_4,_1> Q21;
  Matrix<double,_4,_1,_0,_4,_1> P22;
  Matrix<double,_4,_1,_0,_4,_1> P21;
  Matrix<double,_4,_1,_0,_4,_1> Q12;
  Matrix<double,_4,_1,_0,_4,_1> Q11;
  Matrix<double,_4,_1,_0,_4,_1> P12;
  Matrix<double,_4,_1,_0,_4,_1> P11;
  Matrix<double,_4,_1,_0,_4,_1> Nu;
  Matrix<double,_4,_1,_0,_4,_1> Pi;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar89 = std::
           vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           ::size(plPair);
  if ((sVar89 != 0) &&
     (sVar89 = std::
               vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
               ::size(lPair), 2 < sVar89)) {
    pdVar1 = Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
             + 3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)pdVar1);
    this = P11.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
           3;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this);
    this_00 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (P12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_00);
    this_01 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (Q11.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_01);
    this_02 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (Q12.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_02);
    this_03 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (P21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_03);
    this_04 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (P22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_04);
    this_05 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (Q21.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_05);
    this_06 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (Q22.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_06);
    this_07 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (P31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_07);
    this_08 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (P32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_08);
    this_09 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (Q31.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_09);
    this_10 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              (Q32.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)this_10);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)local_1f8);
    pvVar90 = std::
              vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              ::operator[](plPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)pdVar1,&pvVar90->first);
    pvVar90 = std::
              vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              ::operator[](plPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this,&pvVar90->second);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_00,(Matrix<double,_4,_1,_0,_4,_1> *)pvVar91);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_01,&(pvVar91->first).second);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_02,&(pvVar91->second).first);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,0);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_03,&(pvVar91->second).second);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,1);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_04,(Matrix<double,_4,_1,_0,_4,_1> *)pvVar91);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,1);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_05,&(pvVar91->first).second);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,1);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_06,&(pvVar91->second).first);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,1);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_07,&(pvVar91->second).second);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,2);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_08,(Matrix<double,_4,_1,_0,_4,_1> *)pvVar91);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,2);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_09,&(pvVar91->first).second);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,2);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)this_10,&(pvVar91->second).first);
    pvVar91 = std::
              vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              ::operator[](lPair,2);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)local_1f8,&(pvVar91->second).second);
    other = (Matrix<double,3,1,0,3,1> *)
            (tP12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)other);
    this_11 = (Matrix<double,3,1,0,3,1> *)
              (tQ11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)this_11);
    other_00 = (Matrix<double,3,1,0,3,1> *)
               (tQ12.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)other_00);
    this_12 = (Matrix<double,3,1,0,3,1> *)
              (tP21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)this_12);
    other_01 = (Matrix<double,3,1,0,3,1> *)
               (tP22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)other_01);
    this_13 = (Matrix<double,3,1,0,3,1> *)
              (tQ21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)this_13);
    other_02 = (Matrix<double,3,1,0,3,1> *)
               (tQ22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)other_02);
    this_14 = (Matrix<double,3,1,0,3,1> *)
              (tP31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)this_14);
    other_03 = (Matrix<double,3,1,0,3,1> *)
               (tP32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)other_03);
    this_15 = (Matrix<double,3,1,0,3,1> *)
              (tQ31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)this_15);
    other_04 = (Matrix<double,3,1,0,3,1> *)
               (tQ32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)other_04);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_320);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_3b0,this_00,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_00,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_378,local_3b0,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (other,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                      *)&local_378);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_440,this_01,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_01,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_408,local_440,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_11,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                        *)&local_408);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_4d0,this_02,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_02,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_498,local_4d0,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (other_00,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_498);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_560,this_03,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_03,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_528,local_560,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_12,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                        *)&local_528);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_5f0,this_04,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_04,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_5b8,local_5f0,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (other_01,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_5b8);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_680,this_05,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_05,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_648,local_680,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_13,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                        *)&local_648);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_710,this_06,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_06,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_6d8,local_710,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (other_02,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_6d8);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_7a0,this_07,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_07,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_768,local_7a0,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_14,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                        *)&local_768);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_830,this_08,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_08,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_7f8,local_830,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (other_03,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_7f8);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_8c0,this_09,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_09,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_888,local_8c0,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_15,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                        *)&local_888);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)local_950,this_10,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)this_10,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_918,local_950,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (other_04,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                         *)&local_918);
    this_16 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> *)
              (D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 2);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>((Type *)this_16,local_1f8,3);
    pSVar92 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)local_1f8,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::operator/
              (&local_9a8,this_16,pSVar92);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (local_320,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>_>_>
                *)&local_9a8);
    this_17 = (Matrix<double,3,1,0,3,1> *)
              (L11.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array + 5);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)this_17);
    pDVar2 = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)pDVar2);
    pDVar3 = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)pDVar3);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_a88);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_aa0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_11,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_17,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_aa0);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_ad8,pDVar2,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              (local_ad8,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_17);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              ((type *)local_af0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_11,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>((Type *)local_b28,pDVar2,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=(local_b28,local_af0);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_b68,pDVar2,3);
    local_b30 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm(local_b68);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=(pDVar2,&local_b30);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_b80,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_13,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_01);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_17,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_b80);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_bb8,pDVar3,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              (local_bb8,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_17);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              ((type *)local_bd0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_13,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_01);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>((Type *)local_c08,pDVar3,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=(local_c08,local_bd0);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_c48,pDVar3,3);
    local_c10 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm(local_c48);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=(pDVar3,&local_c10);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_c60,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_15,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_03);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_17,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_c60);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)local_c98,local_a88,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              (local_c98,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_17);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              ((type *)local_cb0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_15,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_03);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)local_ce8,local_a88,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=(local_ce8,local_cb0);
    this_18 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
              (L12.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
               array + 5);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)this_18,local_a88,3);
    local_cf0 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm(this_18);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=(local_a88,&local_cf0);
    pDVar2 = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)pDVar2);
    pDVar3 = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)pDVar3);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_db8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_dd0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_12,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_00);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_17,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_dd0);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_e08,pDVar2,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              (local_e08,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_17);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              ((type *)local_e20,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_12,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_00);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>((Type *)local_e58,pDVar2,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=(local_e58,local_e20);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_e98,pDVar2,3);
    local_e60 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm(local_e98);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=(pDVar2,&local_e60);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_eb0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_14,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_02);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_17,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_eb0);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_ee8,pDVar3,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              (local_ee8,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_17);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              ((type *)local_f00,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_14,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_02);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>((Type *)local_f38,pDVar3,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=(local_f38,local_f00);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)local_f78,pDVar3,3);
    local_f40 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
                ::norm(local_f78);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=(pDVar3,&local_f40);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (&local_f90,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_320,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_04);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              (this_17,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_f90);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)local_fc8,local_db8,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=
              (local_fc8,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_17);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              ((type *)local_fe0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_320,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other_04);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)local_1018,local_db8,3);
    Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>::operator=(local_1018,local_fe0);
    this_19 = &predTrans.
               super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>((Type *)this_19,local_db8,3);
    local_1020 = Eigen::
                 MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                           ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                             *)this_19);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=(local_db8,&local_1020);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
              (&local_1098,(Matrix<double,_4,_1,_0,_4,_1> *)pdVar1);
    pdVar1 = TV.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf;
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
              ((Matrix<double,_4,_1,_0,_4,_1> *)pdVar1,(Matrix<double,_4,_1,_0,_4,_1> *)this);
    getPredefinedTransformations1Plane3Line<double>
              ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)local_1070,&local_1098,(Matrix<double,_4,_1,_0,_4,_1> *)pdVar1,false);
    pvVar93 = std::
              vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              ::back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                      *)local_1070);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
              ((Matrix<double,_4,_4,_0,_4,_4> *)local_1138,pvVar93);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::pop_back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)local_1070);
    pvVar93 = std::
              vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              ::back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                      *)local_1070);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
              ((Matrix<double,_4,_4,_0,_4,_4> *)
               (TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),pvVar93);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::pop_back((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)local_1070);
    Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix
              ((Matrix<double,_6,_6,_0,_6,_6> *)
               (TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23));
    Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix((Matrix<double,_6,_6,_0,_6,_6> *)local_1408);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Zero(&local_1418,6,6);
    Eigen::Matrix<double,6,6,0,6,6>::operator=
              ((Matrix<double,6,6,0,6,6> *)
               (TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
                *)&local_1418);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_1450,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              (&local_1488,
               (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
               (TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_1488,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_1450);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_14c0,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
              (&local_14f8,
               (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
               (TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_14f8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_14c0);
    local_1584 = -1;
    Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::col
              (&local_1678,
               (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
               (TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              (&local_1648,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
               &local_1678,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((Matrix<double,3,1,0,3,1> *)&local_15e8,
               (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&local_1648);
    getSkew<double>(&local_15d0,&local_15e8);
    Eigen::operator*(&local_1580,&local_1584,(StorageBaseType *)&local_15d0);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_16b0,
               (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
               (TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3,3);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_1558,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                 *)&local_1580,
                (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_16b0);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
              (&local_16e8,
               (DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)
               (TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_16e8,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                *)&local_1558);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Zero(&local_16f8,6,6);
    Eigen::Matrix<double,6,6,0,6,6>::operator=
              ((Matrix<double,6,6,0,6,6> *)local_1408,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
                *)&local_16f8);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_1730,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_1138,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
              (&local_1768,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1408,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_1768,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_1730);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_17a0,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_1138,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomRightCorner<int,int>
              (&local_17d8,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1408,3,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_17d8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_17a0);
    local_1864 = -1;
    Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::col
              (&local_1958,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_1138,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              (&local_1928,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)
               &local_1958,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((Matrix<double,3,1,0,3,1> *)&local_18c8,
               (EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&local_1928);
    getSkew<double>(&local_18b0,&local_18c8);
    Eigen::operator*(&local_1860,&local_1864,(StorageBaseType *)&local_18b0);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_1990,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_1138,3,3);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(&local_1838,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                 *)&local_1860,
                (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_1990);
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::bottomLeftCorner<int,int>
              ((Type *)(u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + 5),(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1408,3
               ,3);
    Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)
               (u1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 5),
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                *)&local_1838);
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)&u11);
    PVar783 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                         (TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array + 0x23),
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         (L21.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array + 5));
    v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         (double)PVar783.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)&u11,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)(v1.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5));
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u11,0);
    dVar4 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u11,1);
    dVar5 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u11,2);
    dVar6 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u11,3);
    dVar7 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u11,4);
    dVar8 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u11,5);
    dVar9 = *pSVar94;
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)&v11);
    PVar783 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1408,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         (L22.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array + 5));
    u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         (double)PVar783.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)&v11,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)(u2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5));
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v11,0);
    dVar10 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v11,1);
    dVar11 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v11,2);
    dVar12 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v11,3);
    dVar13 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v11,4);
    dVar14 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v11,5);
    dVar15 = *pSVar94;
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)&u21);
    PVar783 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                         (TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array + 0x23),
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         (L31.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array + 5));
    v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         (double)PVar783.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)&u21,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)(v2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5));
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u21,0);
    dVar16 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u21,1);
    dVar17 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u21,2);
    dVar18 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u21,3);
    dVar19 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u21,4);
    dVar20 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u21,5);
    dVar21 = *pSVar94;
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)&v21);
    PVar783 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1408,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         (L32.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                          .m_data.array + 5));
    u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         (double)PVar783.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)&v21,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)(u3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5));
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v21,0);
    dVar22 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v21,1);
    dVar23 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v21,2);
    dVar24 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v21,3);
    dVar25 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v21,4);
    dVar26 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v21,5);
    dVar27 = *pSVar94;
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)&u31);
    PVar783 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)
                         (TK.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array + 0x23),
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a88);
    v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         (double)PVar783.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)&u31,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)(v3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 5));
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u31,0);
    dVar28 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u31,1);
    dVar330 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u31,2);
    dVar331 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u31,3);
    dVar332 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u31,4);
    dVar333 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&u31,5);
    dVar334 = *pSVar94;
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)&v31);
    PVar783 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_1408,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_db8);
    local_1c60 = PVar783.m_rhs;
    c1 = (double)PVar783.m_lhs;
    Eigen::Matrix<double,6,1,0,6,1>::operator=
              ((Matrix<double,6,1,0,6,1> *)&v31,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&c1);
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v31,0);
    v32 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v31,1);
    v33 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v31,2);
    v34 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v31,3);
    v35 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v31,4);
    v36 = *pSVar94;
    pSVar94 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&v31,5);
    local_1c58 = *pSVar94;
    dVar335 = dVar4 * dVar16 * dVar330;
    dVar336 = dVar335 * dVar13 * dVar24 * v34;
    dVar434 = dVar335 * dVar12 * dVar25 * v34;
    dVar335 = dVar4 * dVar16 * dVar331;
    dVar337 = dVar335 * dVar12 * dVar25 * v33;
    dVar98 = dVar335 * dVar13 * dVar24 * v33;
    dVar99 = dVar4 * dVar17;
    dVar539 = dVar99 * dVar28 * dVar12 * dVar24 * v35;
    dVar435 = dVar99 * dVar28 * dVar13 * dVar24 * v34;
    dVar338 = dVar99 * dVar331 * dVar13 * dVar24 * v32;
    dVar100 = dVar99 * dVar332 * dVar12 * dVar24 * v32;
    dVar581 = dVar4 * dVar18;
    dVar391 = dVar581 * dVar28 * dVar12 * dVar23 * v35;
    dVar101 = dVar581 * dVar28 * dVar13 * dVar23 * v34;
    dVar339 = dVar581 * dVar330 * dVar13 * dVar22 * v34;
    dVar582 = dVar581 * dVar331 * dVar13;
    dVar335 = dVar582 * dVar22 * v33;
    dVar583 = dVar582 * dVar23 * v32;
    dVar582 = dVar581 * dVar332 * dVar12 * dVar23 * v32;
    dVar390 = dVar4 * dVar19 * dVar330 * dVar12 * dVar22 * v34;
    dVar340 = dVar4 * dVar19 * dVar331 * dVar12 * dVar22 * v33;
    dVar584 = dVar5 * dVar16;
    dVar433 = dVar584 * dVar28 * dVar12;
    dVar102 = dVar433 * dVar24 * v35;
    dVar433 = dVar433 * dVar25 * v34;
    dVar585 = dVar584 * dVar331 * dVar12;
    dVar586 = dVar585 * dVar25 * v32;
    dVar469 = dVar584 * dVar332 * dVar12 * dVar24 * v32;
    dVar587 = dVar5 * dVar18;
    dVar103 = dVar587 * dVar28 * dVar12;
    dVar104 = dVar103 * dVar22 * v35;
    dVar508 = dVar587 * dVar332 * dVar12 * dVar22 * v32;
    dVar341 = dVar5 * dVar19 * dVar28 * dVar12 * dVar22 * v34;
    dVar105 = dVar5 * dVar19 * dVar331 * dVar12 * dVar22 * v32;
    dVar509 = dVar6 * dVar16;
    dVar106 = dVar509 * dVar28 * dVar11;
    dVar716 = dVar106 * dVar24 * v35;
    dVar107 = dVar106 * dVar25 * v34;
    dVar108 = dVar509 * dVar330;
    dVar109 = dVar108 * dVar10 * dVar25 * v34;
    dVar717 = dVar509 * dVar331;
    dVar342 = dVar717 * dVar10 * dVar25 * v33;
    dVar110 = dVar717 * dVar11 * dVar25 * v32;
    dVar510 = dVar509 * dVar332 * dVar11 * dVar24 * v32;
    dVar630 = dVar6 * dVar17;
    dVar343 = dVar630 * dVar28;
    dVar344 = dVar343 * dVar10 * dVar24 * v35;
    dVar345 = dVar630 * dVar332 * dVar10 * dVar24 * v32;
    dVar346 = dVar6 * dVar18;
    dVar540 = dVar346 * dVar28;
    dVar470 = dVar540 * dVar10 * dVar23 * v35;
    dVar106 = dVar540 * dVar11 * dVar22 * v35;
    dVar666 = dVar346 * dVar332 * dVar10 * dVar23 * v32;
    dVar511 = dVar346 * dVar332 * dVar11 * dVar22 * v32;
    dVar538 = dVar6 * dVar19;
    dVar111 = dVar538 * dVar28 * dVar11 * dVar22 * v34;
    dVar112 = dVar538 * dVar330 * dVar10 * dVar22 * v34;
    dVar667 = dVar538 * dVar331 * dVar10 * dVar22 * v33;
    dVar538 = dVar538 * dVar331 * dVar11 * dVar22 * v32;
    dVar579 = dVar7 * dVar16 * dVar330 * dVar10 * dVar24 * v34;
    dVar113 = dVar7 * dVar16 * dVar331 * dVar10 * dVar24 * v33;
    dVar114 = dVar7 * dVar17 * dVar28 * dVar10 * dVar24 * v34;
    dVar580 = dVar7 * dVar17 * dVar331 * dVar10 * dVar24 * v32;
    dVar512 = dVar7 * dVar18;
    dVar115 = dVar512 * dVar28 * dVar10 * dVar23 * v34;
    dVar629 = dVar512 * dVar330 * dVar10 * dVar22 * v34;
    dVar513 = dVar512 * dVar331 * dVar10;
    dVar512 = dVar513 * dVar22 * v33;
    dVar514 = dVar513 * dVar23 * v32;
    dVar513 = dVar99 * dVar330 * dVar12;
    dVar116 = dVar513 * dVar24 * v36;
    dVar668 = dVar513 * dVar26 * v34;
    dVar649 = dVar99 * dVar331 * dVar12;
    dVar650 = dVar649 * dVar26 * v33;
    dVar515 = dVar99 * dVar333 * dVar12 * dVar24 * v33;
    dVar513 = dVar581 * dVar330 * dVar12;
    dVar704 = dVar513 * dVar23 * v36;
    dVar705 = dVar581 * dVar333 * dVar12 * dVar23 * v33;
    dVar715 = dVar4 * dVar20 * dVar330 * dVar12 * dVar23 * v34;
    dVar516 = dVar4 * dVar20 * dVar331 * dVar12 * dVar23 * v33;
    dVar760 = dVar584 * dVar330 * dVar12 * dVar24 * v36;
    dVar651 = dVar584 * dVar330 * dVar14 * dVar24 * v34;
    dVar117 = dVar584 * dVar331 * dVar14 * dVar24 * v33;
    dVar652 = dVar584 * dVar333 * dVar12 * dVar24 * v33;
    dVar782 = dVar5 * dVar17 * dVar28;
    dVar669 = dVar782 * dVar12 * dVar26 * v34;
    dVar782 = dVar782 * dVar14 * dVar24 * v34;
    dVar118 = dVar5 * dVar17 * dVar331;
    dVar653 = dVar118 * dVar12 * dVar26 * v32;
    dVar119 = dVar118 * dVar14 * dVar24 * v32;
    dVar588 = dVar587 * dVar28 * dVar14 * dVar23 * v34;
    dVar118 = dVar587 * dVar330 * dVar12 * dVar22 * v36;
    dVar120 = dVar587 * dVar330 * dVar14 * dVar22 * v34;
    dVar121 = dVar587 * dVar331 * dVar14;
    dVar517 = dVar121 * dVar22 * v33;
    dVar122 = dVar121 * dVar23 * v32;
    dVar121 = dVar587 * dVar333 * dVar12 * dVar22 * v33;
    dVar518 = dVar5 * dVar20 * dVar28 * dVar12 * dVar23 * v34;
    dVar123 = dVar5 * dVar20 * dVar331 * dVar12 * dVar23 * v32;
    dVar124 = dVar108 * dVar11 * dVar24 * v36;
    dVar670 = dVar509 * dVar333 * dVar11 * dVar24 * v33;
    dVar125 = dVar343 * dVar11 * dVar26 * v34;
    dVar126 = dVar630 * dVar330 * dVar10;
    dVar29 = dVar126 * dVar24 * v36;
    dVar127 = dVar126 * dVar26 * v34;
    dVar671 = dVar630 * dVar331;
    dVar589 = dVar671 * dVar10 * dVar26 * v33;
    dVar128 = dVar671 * dVar11 * dVar26 * v32;
    dVar129 = dVar630 * dVar333 * dVar10 * dVar24 * v33;
    dVar590 = dVar346 * dVar330;
    dVar130 = dVar590 * dVar10 * dVar23 * v36;
    dVar126 = dVar590 * dVar11 * dVar22 * v36;
    dVar30 = dVar346 * dVar333 * dVar10 * dVar23 * v33;
    dVar31 = dVar346 * dVar333 * dVar11 * dVar22 * v33;
    dVar32 = dVar6 * dVar20;
    dVar33 = dVar32 * dVar28 * dVar11 * dVar23 * v34;
    dVar131 = dVar32 * dVar330 * dVar10 * dVar23 * v34;
    dVar34 = dVar32 * dVar331 * dVar10 * dVar23 * v33;
    dVar132 = dVar32 * dVar331 * dVar11 * dVar23 * v32;
    dVar32 = dVar8 * dVar16 * dVar330 * dVar11 * dVar24 * v34;
    dVar35 = dVar8 * dVar16 * dVar331 * dVar11 * dVar24 * v33;
    dVar133 = dVar8 * dVar17 * dVar28 * dVar11 * dVar24 * v34;
    dVar36 = dVar8 * dVar17 * dVar331 * dVar11 * dVar24 * v32;
    dVar134 = dVar8 * dVar18;
    dVar135 = dVar134 * dVar28 * dVar11 * dVar23 * v34;
    dVar136 = dVar134 * dVar330 * dVar11 * dVar22 * v34;
    dVar134 = dVar134 * dVar331 * dVar11;
    dVar137 = dVar134 * dVar22 * v33;
    dVar138 = dVar134 * dVar23 * v32;
    dVar134 = dVar649 * dVar24 * local_1c58;
    dVar139 = dVar99 * dVar334 * dVar12 * dVar24 * v34;
    dVar513 = dVar513 * dVar27 * v34;
    dVar99 = dVar581 * dVar331 * dVar12;
    dVar649 = dVar99 * dVar23 * local_1c58;
    dVar140 = dVar99 * dVar27 * v33;
    dVar141 = dVar581 * dVar334 * dVar12 * dVar23 * v34;
    dVar99 = dVar4 * dVar21 * dVar330 * dVar12 * dVar24 * v34;
    dVar581 = dVar4 * dVar21 * dVar331 * dVar12 * dVar24 * v33;
    dVar585 = dVar585 * dVar24 * local_1c58;
    dVar584 = dVar584 * dVar334 * dVar12 * dVar24 * v34;
    dVar103 = dVar103 * dVar27 * v34;
    dVar142 = dVar587 * dVar331 * dVar12;
    dVar143 = dVar142 * dVar22 * local_1c58;
    dVar144 = dVar142 * dVar27 * v32;
    dVar142 = dVar587 * dVar334 * dVar12 * dVar22 * v34;
    dVar587 = dVar5 * dVar21 * dVar28 * dVar12 * dVar24 * v34;
    dVar392 = dVar5 * dVar21 * dVar331 * dVar12 * dVar24 * v32;
    dVar145 = dVar108 * dVar15 * dVar24 * v34;
    dVar108 = dVar717 * dVar11 * dVar24 * local_1c58;
    dVar718 = dVar717 * dVar15 * dVar24 * v33;
    dVar509 = dVar509 * dVar334 * dVar11 * dVar24 * v34;
    dVar146 = dVar343 * dVar15 * dVar24 * v34;
    dVar654 = dVar671 * dVar10 * dVar24 * local_1c58;
    dVar672 = dVar671 * dVar15 * dVar24 * v32;
    dVar631 = dVar630 * dVar334 * dVar10 * dVar24 * v34;
    dVar471 = dVar540 * dVar11 * dVar27 * v34;
    dVar541 = dVar540 * dVar15 * dVar23 * v34;
    dVar519 = dVar590 * dVar10 * dVar27 * v34;
    dVar591 = dVar590 * dVar15 * dVar22 * v34;
    dVar343 = dVar346 * dVar331;
    dVar542 = dVar343 * dVar10 * dVar23 * local_1c58;
    dVar520 = dVar343 * dVar10 * dVar27 * v33;
    dVar592 = dVar343 * dVar11 * dVar22 * local_1c58;
    dVar521 = dVar343 * dVar11 * dVar27 * v32;
    dVar393 = dVar343 * dVar15 * dVar22 * v33;
    dVar472 = dVar343 * dVar15 * dVar23 * v32;
    dVar147 = dVar346 * dVar334 * dVar10 * dVar23 * v34;
    dVar347 = dVar346 * dVar334 * dVar11 * dVar22 * v34;
    dVar346 = dVar6 * dVar21;
    dVar343 = dVar346 * dVar28 * dVar11 * dVar24 * v34;
    dVar148 = dVar346 * dVar330 * dVar10 * dVar24 * v34;
    dVar149 = dVar346 * dVar331 * dVar10 * dVar24 * v33;
    dVar761 = dVar346 * dVar331 * dVar11 * dVar24 * v32;
    dVar706 = dVar9 * dVar16 * dVar330 * dVar12 * dVar24 * v34;
    dVar593 = dVar9 * dVar16 * dVar331 * dVar12 * dVar24 * v33;
    dVar67 = dVar9 * dVar17 * dVar28 * dVar12 * dVar24 * v34;
    dVar707 = dVar9 * dVar17 * dVar331 * dVar12 * dVar24 * v32;
    dVar346 = dVar9 * dVar18;
    dVar436 = dVar346 * dVar28 * dVar12 * dVar23 * v34;
    dVar437 = dVar346 * dVar330 * dVar12 * dVar22 * v34;
    dVar346 = dVar346 * dVar331 * dVar12;
    dVar150 = dVar346 * dVar22 * v33;
    dVar346 = dVar346 * dVar23 * v32;
    dVar543 = dVar4 + dVar4;
    dVar540 = dVar543 * dVar16 * dVar331;
    dVar151 = dVar540 * dVar13 * dVar24 * v32;
    dVar394 = dVar540 * dVar12 * dVar25 * v32;
    dVar708 = dVar543 * dVar18;
    dVar671 = dVar708 * dVar28;
    dVar438 = dVar671 * dVar12 * dVar22 * v35;
    dVar439 = dVar671 * dVar13 * dVar22 * v34;
    dVar717 = dVar708 * dVar332 * dVar12;
    dVar395 = dVar717 * dVar22 * v32;
    dVar473 = dVar543 * dVar19 * dVar331 * dVar12;
    dVar348 = dVar473 * dVar22 * v32;
    dVar522 = dVar6 + dVar6;
    dVar762 = dVar522 * dVar16;
    dVar590 = dVar762 * dVar28 * dVar10;
    dVar440 = dVar590 * dVar24 * v35;
    dVar152 = dVar590 * dVar25 * v34;
    dVar763 = dVar762 * dVar332 * dVar10 * dVar24 * v32;
    dVar594 = dVar522 * dVar19;
    dVar441 = dVar594 * dVar28 * dVar10 * dVar22 * v34;
    dVar442 = dVar7 + dVar7;
    dVar443 = dVar442 * dVar16 * dVar331;
    dVar153 = dVar443 * dVar10 * dVar24 * v32;
    dVar349 = dVar442 * dVar18;
    dVar719 = dVar349 * dVar28 * dVar10 * dVar22 * v34;
    dVar590 = dVar543 * dVar16 * dVar330;
    dVar764 = dVar590 * dVar12 * dVar26 * v34;
    dVar655 = dVar590 * dVar14 * dVar24 * v34;
    dVar154 = dVar540 * dVar12 * dVar26 * v33;
    dVar540 = dVar540 * dVar14 * dVar24 * v33;
    dVar720 = dVar543 * dVar17;
    dVar765 = dVar720 * dVar28 * dVar12 * dVar24 * v36;
    dVar155 = dVar720 * dVar28 * dVar14 * dVar24 * v34;
    dVar630 = dVar720 * dVar330 * dVar12;
    dVar590 = dVar630 * dVar24 * v35;
    dVar766 = dVar630 * dVar25 * v34;
    dVar767 = dVar720 * dVar331;
    dVar156 = dVar767 * dVar12 * dVar25 * v33;
    dVar768 = dVar767 * dVar12 * dVar26 * v32;
    dVar630 = dVar767 * dVar13 * dVar24 * v33;
    dVar157 = dVar767 * dVar14 * dVar24 * v32;
    dVar158 = dVar720 * dVar332 * dVar12 * dVar24 * v33;
    dVar721 = dVar720 * dVar333 * dVar12 * dVar24 * v32;
    dVar632 = dVar671 * dVar12 * dVar23 * v36;
    dVar68 = dVar671 * dVar14 * dVar23 * v34;
    dVar671 = dVar708 * dVar330;
    dVar769 = dVar671 * dVar12 * dVar22 * v36;
    dVar722 = dVar671 * dVar12 * dVar23 * v35;
    dVar723 = dVar671 * dVar13 * dVar23 * v34;
    dVar69 = dVar671 * dVar14 * dVar22 * v34;
    dVar671 = dVar708 * dVar331 * dVar14;
    dVar633 = dVar671 * dVar22 * v33;
    dVar724 = dVar671 * dVar23 * v32;
    dVar159 = dVar717 * dVar23 * v33;
    dVar671 = dVar708 * dVar333 * dVar12;
    dVar725 = dVar671 * dVar22 * v33;
    dVar634 = dVar671 * dVar23 * v32;
    dVar544 = dVar543 * dVar19 * dVar330 * dVar12 * dVar23 * v34;
    dVar474 = dVar473 * dVar23 * v33;
    dVar475 = dVar543 * dVar20 * dVar330 * dVar12 * dVar22 * v34;
    dVar671 = dVar543 * dVar20 * dVar331 * dVar12;
    dVar160 = dVar671 * dVar22 * v33;
    dVar545 = dVar671 * dVar23 * v32;
    dVar635 = dVar5 + dVar5;
    dVar671 = dVar635 * dVar16;
    dVar717 = dVar671 * dVar28 * dVar12;
    dVar726 = dVar717 * dVar24 * v36;
    dVar476 = dVar717 * dVar26 * v34;
    dVar70 = dVar671 * dVar330 * dVar12 * dVar24 * v35;
    dVar546 = dVar671 * dVar330 * dVar13 * dVar24 * v34;
    dVar717 = dVar671 * dVar331;
    dVar727 = dVar717 * dVar12 * dVar25 * v33;
    dVar477 = dVar717 * dVar12 * dVar26 * v32;
    dVar728 = dVar717 * dVar13 * dVar24 * v33;
    dVar547 = dVar717 * dVar14 * dVar24 * v32;
    dVar548 = dVar671 * dVar332 * dVar12 * dVar24 * v33;
    dVar161 = dVar671 * dVar333 * dVar12 * dVar24 * v32;
    dVar671 = dVar635 * dVar17 * dVar28;
    dVar549 = dVar671 * dVar12 * dVar25 * v34;
    dVar478 = dVar671 * dVar13 * dVar24 * v34;
    dVar729 = dVar635 * dVar17 * dVar331;
    dVar162 = dVar729 * dVar12 * dVar25 * v32;
    dVar730 = dVar729 * dVar13 * dVar24 * v32;
    dVar479 = dVar635 * dVar18;
    dVar671 = dVar479 * dVar28;
    dVar71 = dVar671 * dVar12 * dVar22 * v36;
    dVar550 = dVar671 * dVar12 * dVar23 * v35;
    dVar551 = dVar671 * dVar13 * dVar23 * v34;
    dVar163 = dVar671 * dVar14 * dVar22 * v34;
    dVar552 = dVar479 * dVar330;
    dVar553 = dVar552 * dVar12 * dVar22 * v35;
    dVar164 = dVar552 * dVar13 * dVar22 * v34;
    dVar671 = dVar479 * dVar331 * dVar13;
    dVar731 = dVar671 * dVar22 * v33;
    dVar165 = dVar671 * dVar23 * v32;
    dVar671 = dVar479 * dVar332 * dVar12;
    dVar732 = dVar671 * dVar22 * v33;
    dVar554 = dVar671 * dVar23 * v32;
    dVar555 = dVar479 * dVar333 * dVar12;
    dVar556 = dVar555 * dVar22 * v32;
    dVar396 = dVar635 * dVar19 * dVar28 * dVar12 * dVar23 * v34;
    dVar671 = dVar635 * dVar19 * dVar331 * dVar12;
    dVar72 = dVar671 * dVar22 * v33;
    dVar166 = dVar671 * dVar23 * v32;
    dVar397 = dVar635 * dVar20 * dVar28 * dVar12 * dVar22 * v34;
    dVar73 = dVar635 * dVar20 * dVar331 * dVar12;
    dVar398 = dVar73 * dVar22 * v32;
    dVar671 = dVar762 * dVar28 * dVar11;
    dVar399 = dVar671 * dVar24 * v36;
    dVar673 = dVar671 * dVar26 * v34;
    dVar671 = dVar762 * dVar330 * dVar10;
    dVar557 = dVar671 * dVar24 * v36;
    dVar400 = dVar671 * dVar26 * v34;
    dVar671 = dVar762 * dVar330 * dVar11;
    dVar401 = dVar671 * dVar24 * v35;
    dVar167 = dVar671 * dVar25 * v34;
    dVar168 = dVar762 * dVar331;
    dVar169 = dVar168 * dVar10 * dVar26 * v33;
    dVar170 = dVar168 * dVar11 * dVar26 * v32;
    dVar671 = dVar762 * dVar332 * dVar11 * dVar24 * v33;
    dVar402 = dVar762 * dVar333 * dVar10 * dVar24 * v33;
    dVar674 = dVar762 * dVar333 * dVar11 * dVar24 * v32;
    dVar403 = dVar522 * dVar17;
    dVar717 = dVar403 * dVar28 * dVar10;
    dVar171 = dVar717 * dVar24 * v36;
    dVar717 = dVar717 * dVar26 * v34;
    dVar473 = dVar403 * dVar28 * dVar11;
    dVar770 = dVar473 * dVar24 * v35;
    dVar558 = dVar473 * dVar25 * v34;
    dVar473 = dVar403 * dVar330 * dVar10;
    dVar172 = dVar473 * dVar24 * v35;
    dVar559 = dVar473 * dVar25 * v34;
    dVar771 = dVar403 * dVar331;
    dVar473 = dVar771 * dVar10 * dVar25 * v33;
    dVar173 = dVar771 * dVar11 * dVar25 * v32;
    dVar733 = dVar403 * dVar332 * dVar10 * dVar24 * v33;
    dVar174 = dVar403 * dVar332 * dVar11 * dVar24 * v32;
    dVar734 = dVar403 * dVar333 * dVar10 * dVar24 * v32;
    dVar767 = dVar522 * dVar18;
    dVar675 = dVar767 * dVar28;
    dVar676 = dVar675 * dVar10 * dVar23 * v36;
    dVar175 = dVar675 * dVar11 * dVar22 * v36;
    dVar735 = dVar767 * dVar330;
    dVar176 = dVar735 * dVar10 * dVar23 * v35;
    dVar177 = dVar735 * dVar11 * dVar22 * v35;
    dVar178 = dVar767 * dVar332 * dVar10 * dVar23 * v33;
    dVar720 = dVar767 * dVar332 * dVar11 * dVar22 * v33;
    dVar179 = dVar767 * dVar333 * dVar10 * dVar23 * v32;
    dVar180 = dVar767 * dVar333 * dVar11 * dVar22 * v32;
    dVar767 = dVar594 * dVar28 * dVar11 * dVar23 * v34;
    dVar37 = dVar594 * dVar330 * dVar10 * dVar23 * v34;
    dVar38 = dVar594 * dVar330 * dVar11 * dVar22 * v34;
    dVar181 = dVar594 * dVar331 * dVar10 * dVar23 * v33;
    dVar595 = dVar594 * dVar331 * dVar11 * dVar23 * v32;
    dVar594 = dVar522 * dVar20;
    dVar39 = dVar594 * dVar28 * dVar10 * dVar23 * v34;
    dVar182 = dVar594 * dVar28 * dVar11 * dVar22 * v34;
    dVar183 = dVar594 * dVar330 * dVar10 * dVar22 * v34;
    dVar596 = dVar594 * dVar331 * dVar10 * dVar22 * v33;
    dVar40 = dVar594 * dVar331 * dVar11 * dVar22 * v32;
    dVar184 = dVar442 * dVar16 * dVar330 * dVar11 * dVar24 * v34;
    dVar444 = dVar443 * dVar11 * dVar24 * v33;
    dVar185 = dVar442 * dVar17 * dVar28 * dVar11 * dVar24 * v34;
    dVar442 = dVar442 * dVar17 * dVar331;
    dVar597 = dVar442 * dVar10 * dVar24 * v33;
    dVar442 = dVar442 * dVar11 * dVar24 * v32;
    dVar350 = dVar349 * dVar28 * dVar11 * dVar23 * v34;
    dVar443 = dVar349 * dVar330 * dVar10 * dVar23 * v34;
    dVar351 = dVar349 * dVar330 * dVar11 * dVar22 * v34;
    dVar186 = dVar349 * dVar331 * dVar11;
    dVar349 = dVar186 * dVar22 * v33;
    dVar187 = dVar186 * dVar23 * v32;
    dVar352 = dVar8 + dVar8;
    dVar445 = dVar352 * dVar16 * dVar330 * dVar10 * dVar24 * v34;
    dVar186 = dVar352 * dVar16 * dVar331;
    dVar446 = dVar186 * dVar10 * dVar24 * v33;
    dVar188 = dVar186 * dVar11 * dVar24 * v32;
    dVar189 = dVar352 * dVar17 * dVar28 * dVar10 * dVar24 * v34;
    dVar598 = dVar352 * dVar17 * dVar331;
    dVar599 = dVar598 * dVar10 * dVar24 * v32;
    dVar352 = dVar352 * dVar18;
    dVar447 = dVar352 * dVar28 * dVar10 * dVar23 * v34;
    dVar186 = dVar352 * dVar28 * dVar11 * dVar22 * v34;
    dVar448 = dVar352 * dVar330 * dVar10 * dVar22 * v34;
    dVar353 = dVar352 * dVar331 * dVar10;
    dVar449 = dVar353 * dVar22 * v33;
    dVar354 = dVar353 * dVar23 * v32;
    dVar353 = dVar708 * dVar331 * dVar12;
    dVar450 = dVar353 * dVar22 * local_1c58;
    dVar190 = dVar353 * dVar27 * v32;
    dVar709 = dVar708 * dVar334 * dVar12 * dVar22 * v34;
    dVar353 = dVar543 * dVar21 * dVar331 * dVar12 * dVar24 * v32;
    dVar543 = dVar729 * dVar12 * dVar26 * v33;
    dVar191 = dVar729 * dVar14 * dVar24 * v33;
    dVar192 = dVar552 * dVar12 * dVar23 * v36;
    dVar193 = dVar552 * dVar14 * dVar23 * v34;
    dVar552 = dVar555 * dVar23 * v33;
    dVar74 = dVar73 * dVar23 * v33;
    dVar73 = dVar168 * dVar10 * dVar24 * local_1c58;
    dVar194 = dVar168 * dVar15 * dVar24 * v32;
    dVar168 = dVar762 * dVar334 * dVar10 * dVar24 * v34;
    dVar555 = dVar403 * dVar330 * dVar11;
    dVar708 = dVar555 * dVar24 * v36;
    dVar195 = dVar555 * dVar26 * v34;
    dVar196 = dVar403 * dVar333 * dVar11 * dVar24 * v33;
    dVar555 = dVar675 * dVar10 * dVar27 * v34;
    dVar197 = dVar675 * dVar15 * dVar22 * v34;
    dVar198 = dVar594 * dVar330 * dVar11 * dVar23 * v34;
    dVar594 = dVar522 * dVar21 * dVar28 * dVar10 * dVar24 * v34;
    dVar199 = dVar598 * dVar11 * dVar24 * v33;
    dVar200 = dVar352 * dVar330 * dVar11 * dVar23 * v34;
    dVar598 = dVar9 + dVar9;
    dVar201 = dVar598 * dVar16 * dVar331 * dVar12 * dVar24 * v32;
    dVar202 = dVar598 * dVar18 * dVar28 * dVar12 * dVar22 * v34;
    dVar352 = dVar479 * dVar331 * dVar12;
    dVar203 = dVar352 * dVar23 * local_1c58;
    dVar352 = dVar352 * dVar27 * v33;
    dVar480 = dVar479 * dVar334 * dVar12 * dVar23 * v34;
    dVar636 = dVar635 * dVar21 * dVar331 * dVar12 * dVar24 * v33;
    dVar560 = dVar771 * dVar11 * dVar24 * local_1c58;
    dVar772 = dVar771 * dVar15 * dVar24 * v33;
    dVar404 = dVar403 * dVar334 * dVar11 * dVar24 * v34;
    dVar677 = dVar735 * dVar11 * dVar27 * v34;
    dVar736 = dVar735 * dVar15 * dVar23 * v34;
    dVar523 = dVar522 * dVar21 * dVar330 * dVar11 * dVar24 * v34;
    dVar204 = dVar598 * dVar17 * dVar331 * dVar12 * dVar24 * v33;
    dVar598 = dVar598 * dVar18 * dVar330 * dVar12 * dVar23 * v34;
    dVar710 = dVar4 + dVar4;
    dVar479 = dVar710 * dVar16 * dVar331;
    dVar403 = dVar4 * 4.0;
    dVar522 = dVar403 * dVar16 * dVar331;
    dVar524 = dVar522 * dVar12 * dVar26 * v32;
    dVar405 = dVar479 * dVar13 * dVar24 * v33;
    dVar451 = dVar479 * dVar12 * dVar25 * v33;
    dVar481 = dVar522 * dVar14 * dVar24 * v32;
    dVar452 = dVar403 * dVar17 * dVar331;
    dVar453 = dVar452 * dVar12 * dVar25 * v32;
    dVar561 = dVar710 * dVar17 * dVar331;
    dVar205 = dVar561 * dVar13 * dVar24 * v32;
    dVar206 = dVar403 * dVar18;
    dVar525 = dVar206 * dVar28 * dVar12 * dVar22 * v36;
    dVar454 = dVar710 * dVar18;
    dVar406 = dVar454 * dVar28 * dVar12 * dVar23 * v35;
    dVar455 = dVar454 * dVar28 * dVar13 * dVar23 * v34;
    dVar355 = dVar206 * dVar28 * dVar14 * dVar22 * v34;
    dVar356 = dVar206 * dVar330 * dVar12 * dVar22 * v35;
    dVar357 = dVar454 * dVar330 * dVar13 * dVar22 * v34;
    dVar526 = dVar206 * dVar332 * dVar12 * dVar22 * v33;
    dVar456 = dVar454 * dVar332 * dVar12 * dVar23 * v32;
    dVar207 = dVar206 * dVar333 * dVar12 * dVar22 * v32;
    dVar527 = dVar710 * dVar19 * dVar331 * dVar12 * dVar22 * v33;
    dVar528 = dVar403 * dVar19 * dVar331 * dVar12 * dVar23 * v32;
    dVar403 = dVar403 * dVar20 * dVar331 * dVar12 * dVar22 * v32;
    dVar457 = dVar5 + dVar5;
    dVar678 = dVar457 * dVar16 * dVar331;
    dVar679 = dVar678 * dVar12;
    dVar208 = dVar679 * dVar25 * v32;
    dVar600 = dVar5 * 4.0;
    dVar407 = dVar600 * dVar16 * dVar331;
    dVar408 = dVar407 * dVar13 * dVar24 * v32;
    dVar409 = dVar457 * dVar18;
    dVar410 = dVar409 * dVar28 * dVar12;
    dVar479 = dVar410 * dVar22 * v35;
    dVar601 = dVar600 * dVar18;
    dVar602 = dVar601 * dVar28 * dVar13 * dVar22 * v34;
    dVar522 = dVar409 * dVar332 * dVar12 * dVar22 * v32;
    dVar635 = dVar457 * dVar19 * dVar331 * dVar12 * dVar22 * v32;
    dVar656 = dVar6 * 4.0;
    dVar209 = dVar656 * dVar16;
    dVar675 = dVar209 * dVar28 * dVar10;
    dVar603 = dVar675 * dVar24 * v36;
    dVar358 = dVar675 * dVar26 * v34;
    dVar637 = dVar6 + dVar6;
    dVar675 = dVar637 * dVar16;
    dVar729 = dVar675 * dVar28 * dVar11;
    dVar604 = dVar729 * dVar24 * v35;
    dVar729 = dVar729 * dVar25 * v34;
    dVar359 = dVar209 * dVar330 * dVar10 * dVar24 * v35;
    dVar605 = dVar675 * dVar330;
    dVar735 = dVar605 * dVar10 * dVar25 * v34;
    dVar762 = dVar209 * dVar332 * dVar10 * dVar24 * v33;
    dVar771 = dVar675 * dVar332 * dVar11 * dVar24 * v32;
    dVar210 = dVar209 * dVar333 * dVar10 * dVar24 * v32;
    dVar360 = dVar637 * dVar17;
    dVar361 = dVar360 * dVar28;
    dVar737 = dVar361 * dVar10 * dVar24 * v35;
    dVar211 = dVar656 * dVar17;
    dVar212 = dVar211 * dVar28 * dVar10 * dVar25 * v34;
    dVar41 = dVar360 * dVar332 * dVar10 * dVar24 * v32;
    dVar738 = dVar656 * dVar19 * dVar28 * dVar10 * dVar23 * v34;
    dVar213 = dVar637 * dVar19 * dVar28 * dVar11 * dVar22 * v34;
    dVar42 = dVar637 * dVar19 * dVar330 * dVar10 * dVar22 * v34;
    dVar657 = dVar656 * dVar20 * dVar28 * dVar10 * dVar22 * v34;
    dVar658 = dVar7 + dVar7;
    dVar739 = dVar658 * dVar16 * dVar331 * dVar10 * dVar24 * v33;
    dVar773 = dVar7 * 4.0;
    dVar75 = dVar773 * dVar16 * dVar331 * dVar11 * dVar24 * v32;
    dVar740 = dVar658 * dVar17 * dVar331 * dVar10 * dVar24 * v32;
    dVar741 = dVar658 * dVar18 * dVar28 * dVar10 * dVar23 * v34;
    dVar43 = dVar773 * dVar18 * dVar28 * dVar11 * dVar22 * v34;
    dVar659 = dVar658 * dVar18 * dVar330 * dVar10 * dVar22 * v34;
    dVar363 = dVar8 * 4.0;
    dVar214 = dVar363 * dVar16 * dVar331 * dVar10 * dVar24 * v32;
    dVar215 = dVar363 * dVar18 * dVar28 * dVar10 * dVar22 * v34;
    dVar561 = dVar561 * dVar12;
    dVar216 = dVar561 * dVar26 * v33;
    dVar217 = dVar452 * dVar14 * dVar24 * v33;
    dVar452 = dVar454 * dVar330 * dVar12;
    dVar658 = dVar452 * dVar23 * v36;
    dVar218 = dVar206 * dVar330 * dVar14 * dVar23 * v34;
    dVar219 = dVar454 * dVar333 * dVar12 * dVar23 * v33;
    dVar220 = dVar710 * dVar20 * dVar331 * dVar12 * dVar23 * v33;
    dVar221 = dVar407 * dVar12 * dVar26 * v33;
    dVar222 = dVar678 * dVar14 * dVar24 * v33;
    dVar206 = dVar600 * dVar17 * dVar331;
    dVar407 = dVar206 * dVar12 * dVar25 * v33;
    dVar454 = dVar457 * dVar17 * dVar331;
    dVar678 = dVar454 * dVar12 * dVar26 * v32;
    dVar223 = dVar206 * dVar13 * dVar24 * v33;
    dVar224 = dVar454 * dVar14 * dVar24 * v32;
    dVar225 = dVar601 * dVar28 * dVar12 * dVar23 * v36;
    dVar206 = dVar409 * dVar28 * dVar14 * dVar23 * v34;
    dVar454 = dVar409 * dVar330 * dVar12 * dVar22 * v36;
    dVar44 = dVar601 * dVar330 * dVar12 * dVar23 * v35;
    dVar45 = dVar601 * dVar330 * dVar13 * dVar23 * v34;
    dVar226 = dVar409 * dVar330 * dVar14 * dVar22 * v34;
    dVar227 = dVar601 * dVar332 * dVar12 * dVar23 * v33;
    dVar409 = dVar409 * dVar333 * dVar12 * dVar22 * v33;
    dVar601 = dVar601 * dVar333 * dVar12 * dVar23 * v32;
    dVar228 = dVar600 * dVar19 * dVar331 * dVar12 * dVar23 * v33;
    dVar229 = dVar600 * dVar20 * dVar331 * dVar12 * dVar22 * v33;
    dVar230 = dVar457 * dVar20 * dVar331 * dVar12 * dVar23 * v32;
    dVar231 = dVar605 * dVar11 * dVar24 * v36;
    dVar232 = dVar209 * dVar330 * dVar11 * dVar26 * v34;
    dVar675 = dVar675 * dVar333 * dVar11 * dVar24 * v33;
    dVar209 = dVar211 * dVar28 * dVar11 * dVar24 * v36;
    dVar233 = dVar361 * dVar11 * dVar26 * v34;
    dVar600 = dVar360 * dVar330 * dVar10;
    dVar234 = dVar600 * dVar24 * v36;
    dVar600 = dVar600 * dVar26 * v34;
    dVar235 = dVar211 * dVar330 * dVar11;
    dVar236 = dVar235 * dVar24 * v35;
    dVar235 = dVar235 * dVar25 * v34;
    dVar237 = dVar211 * dVar332 * dVar11 * dVar24 * v33;
    dVar238 = dVar360 * dVar333 * dVar10 * dVar24 * v33;
    dVar211 = dVar211 * dVar333 * dVar11 * dVar24 * v32;
    dVar239 = dVar656 * dVar19 * dVar330 * dVar11 * dVar23 * v34;
    dVar240 = dVar637 * dVar20 * dVar28 * dVar11 * dVar23 * v34;
    dVar360 = dVar637 * dVar20 * dVar330 * dVar10 * dVar23 * v34;
    dVar656 = dVar656 * dVar20 * dVar330 * dVar11 * dVar22 * v34;
    dVar774 = dVar773 * dVar17 * dVar331 * dVar11 * dVar24 * v33;
    dVar742 = dVar773 * dVar18 * dVar330 * dVar11 * dVar23 * v34;
    dVar773 = dVar8 + dVar8;
    dVar743 = dVar773 * dVar16 * dVar331 * dVar11 * dVar24 * v33;
    dVar76 = dVar363 * dVar17 * dVar331 * dVar10 * dVar24 * v33;
    dVar77 = dVar773 * dVar17 * dVar331 * dVar11 * dVar24 * v32;
    dVar78 = dVar773 * dVar18 * dVar28 * dVar11 * dVar23 * v34;
    dVar660 = dVar363 * dVar18 * dVar330 * dVar10 * dVar23 * v34;
    dVar773 = dVar773 * dVar18 * dVar330 * dVar11 * dVar22 * v34;
    dVar562 = dVar561 * dVar24 * local_1c58;
    dVar482 = dVar710 * dVar17 * dVar334 * dVar12 * dVar24 * v34;
    dVar241 = dVar452 * dVar27 * v34;
    dVar711 = dVar710 * dVar21 * dVar330 * dVar12 * dVar24 * v34;
    dVar680 = dVar679 * dVar24 * local_1c58;
    dVar529 = dVar457 * dVar16 * dVar334 * dVar12 * dVar24 * v34;
    dVar411 = dVar410 * dVar27 * v34;
    dVar458 = dVar457 * dVar21 * dVar28 * dVar12 * dVar24 * v34;
    dVar606 = dVar605 * dVar15 * dVar24 * v34;
    dVar362 = dVar361 * dVar15 * dVar24 * v34;
    dVar452 = dVar637 * dVar18 * dVar331;
    dVar530 = dVar452 * dVar10 * dVar23 * local_1c58;
    dVar483 = dVar452 * dVar10 * dVar27 * v33;
    dVar607 = dVar452 * dVar11 * dVar22 * local_1c58;
    dVar484 = dVar452 * dVar11 * dVar27 * v32;
    dVar412 = dVar452 * dVar15 * dVar22 * v33;
    dVar459 = dVar452 * dVar15 * dVar23 * v32;
    dVar363 = dVar637 * dVar18 * dVar334;
    dVar452 = dVar363 * dVar10 * dVar23 * v34;
    dVar364 = dVar363 * dVar11 * dVar22 * v34;
    dVar363 = dVar637 * dVar21 * dVar331;
    dVar242 = dVar363 * dVar10 * dVar24 * v33;
    dVar638 = dVar363 * dVar11 * dVar24 * v32;
    dVar363 = dVar9 + dVar9;
    dVar460 = dVar363 * dVar16 * dVar330 * dVar12 * dVar24 * v34;
    dVar639 = dVar363 * dVar17 * dVar28 * dVar12 * dVar24 * v34;
    dVar363 = dVar363 * dVar18 * dVar331 * dVar12;
    dVar243 = dVar363 * dVar22 * v33;
    dVar363 = dVar363 * dVar23 * v32;
    dVar485 = dVar4 + dVar4;
    dVar410 = dVar485 * dVar16 * dVar331;
    dVar413 = dVar410 * dVar12 * dVar25 * v32;
    dVar365 = dVar410 * dVar13 * dVar24 * v32;
    dVar712 = dVar485 * dVar18;
    dVar637 = dVar712 * dVar28;
    dVar563 = dVar637 * dVar12 * dVar22 * v35;
    dVar366 = dVar637 * dVar13 * dVar22 * v34;
    dVar561 = dVar712 * dVar332 * dVar12;
    dVar608 = dVar561 * dVar22 * v32;
    dVar605 = dVar485 * dVar19 * dVar331 * dVar12;
    dVar367 = dVar605 * dVar22 * v32;
    dVar531 = dVar6 + dVar6;
    dVar368 = dVar531 * dVar16;
    dVar361 = dVar368 * dVar28 * dVar10;
    dVar661 = dVar361 * dVar24 * v35;
    dVar369 = dVar361 * dVar25 * v34;
    dVar609 = dVar368 * dVar332 * dVar10 * dVar24 * v32;
    dVar610 = dVar531 * dVar19;
    dVar611 = dVar610 * dVar28 * dVar10 * dVar22 * v34;
    dVar370 = dVar7 + dVar7;
    dVar662 = dVar370 * dVar16 * dVar331;
    dVar663 = dVar662 * dVar10 * dVar24 * v32;
    dVar612 = dVar370 * dVar18;
    dVar79 = dVar612 * dVar28 * dVar10 * dVar22 * v34;
    dVar361 = dVar485 * dVar16 * dVar330;
    dVar80 = dVar361 * dVar12 * dVar26 * v34;
    dVar361 = dVar361 * dVar14 * dVar24 * v34;
    dVar244 = dVar410 * dVar12 * dVar26 * v33;
    dVar461 = dVar410 * dVar14 * dVar24 * v33;
    dVar457 = dVar485 * dVar17;
    dVar775 = dVar457 * dVar28 * dVar12 * dVar24 * v36;
    dVar462 = dVar457 * dVar28 * dVar14 * dVar24 * v34;
    dVar410 = dVar457 * dVar330 * dVar12;
    dVar245 = dVar410 * dVar24 * v35;
    dVar463 = dVar410 * dVar25 * v34;
    dVar679 = dVar457 * dVar331;
    dVar410 = dVar679 * dVar12 * dVar25 * v33;
    dVar246 = dVar679 * dVar12 * dVar26 * v32;
    dVar464 = dVar679 * dVar13 * dVar24 * v33;
    dVar776 = dVar679 * dVar14 * dVar24 * v32;
    dVar465 = dVar457 * dVar332 * dVar12 * dVar24 * v33;
    dVar81 = dVar457 * dVar333 * dVar12 * dVar24 * v32;
    dVar681 = dVar637 * dVar12 * dVar23 * v36;
    dVar744 = dVar637 * dVar14 * dVar23 * v34;
    dVar457 = dVar712 * dVar330;
    dVar682 = dVar457 * dVar12 * dVar22 * v36;
    dVar82 = dVar457 * dVar12 * dVar23 * v35;
    dVar683 = dVar457 * dVar13 * dVar23 * v34;
    dVar466 = dVar457 * dVar14 * dVar22 * v34;
    dVar457 = dVar712 * dVar331 * dVar14;
    dVar745 = dVar457 * dVar22 * v33;
    dVar684 = dVar457 * dVar23 * v32;
    dVar414 = dVar561 * dVar23 * v33;
    dVar457 = dVar712 * dVar333 * dVar12;
    dVar685 = dVar457 * dVar22 * v33;
    dVar415 = dVar457 * dVar23 * v32;
    dVar486 = dVar485 * dVar19 * dVar330 * dVar12 * dVar23 * v34;
    dVar640 = dVar605 * dVar23 * v33;
    dVar416 = dVar485 * dVar20 * dVar330 * dVar12 * dVar22 * v34;
    dVar457 = dVar485 * dVar20 * dVar331 * dVar12;
    dVar641 = dVar457 * dVar22 * v33;
    dVar487 = dVar457 * dVar23 * v32;
    dVar642 = dVar5 + dVar5;
    dVar561 = dVar642 * dVar16;
    dVar457 = dVar561 * dVar28 * dVar12;
    dVar746 = dVar457 * dVar24 * v36;
    dVar686 = dVar457 * dVar26 * v34;
    dVar747 = dVar561 * dVar330 * dVar12 * dVar24 * v35;
    dVar417 = dVar561 * dVar330 * dVar13 * dVar24 * v34;
    dVar457 = dVar561 * dVar331;
    dVar83 = dVar457 * dVar12 * dVar25 * v33;
    dVar687 = dVar457 * dVar12 * dVar26 * v32;
    dVar688 = dVar457 * dVar13 * dVar24 * v33;
    dVar418 = dVar457 * dVar14 * dVar24 * v32;
    dVar689 = dVar561 * dVar332 * dVar12 * dVar24 * v33;
    dVar488 = dVar561 * dVar333 * dVar12 * dVar24 * v32;
    dVar457 = dVar642 * dVar17 * dVar28;
    dVar690 = dVar457 * dVar12 * dVar25 * v34;
    dVar419 = dVar457 * dVar13 * dVar24 * v34;
    dVar84 = dVar642 * dVar17 * dVar331;
    dVar85 = dVar84 * dVar12 * dVar25 * v32;
    dVar489 = dVar84 * dVar13 * dVar24 * v32;
    dVar490 = dVar642 * dVar18;
    dVar457 = dVar490 * dVar28;
    dVar748 = dVar457 * dVar12 * dVar22 * v36;
    dVar420 = dVar457 * dVar12 * dVar23 * v35;
    dVar749 = dVar457 * dVar13 * dVar23 * v34;
    dVar691 = dVar457 * dVar14 * dVar22 * v34;
    dVar692 = dVar490 * dVar330;
    dVar693 = dVar692 * dVar12 * dVar22 * v35;
    dVar694 = dVar692 * dVar13 * dVar22 * v34;
    dVar457 = dVar490 * dVar331 * dVar13;
    dVar750 = dVar457 * dVar22 * v33;
    dVar421 = dVar457 * dVar23 * v32;
    dVar457 = dVar490 * dVar332 * dVar12;
    dVar86 = dVar457 * dVar22 * v33;
    dVar695 = dVar457 * dVar23 * v32;
    dVar87 = dVar490 * dVar333 * dVar12;
    dVar422 = dVar87 * dVar22 * v32;
    dVar564 = dVar642 * dVar19 * dVar28 * dVar12 * dVar23 * v34;
    dVar457 = dVar642 * dVar19 * dVar331 * dVar12;
    dVar696 = dVar457 * dVar22 * v33;
    dVar423 = dVar457 * dVar23 * v32;
    dVar697 = dVar642 * dVar20 * dVar28 * dVar12 * dVar22 * v34;
    dVar424 = dVar642 * dVar20 * dVar331 * dVar12;
    dVar425 = dVar424 * dVar22 * v32;
    dVar457 = dVar368 * dVar28 * dVar11;
    dVar565 = dVar457 * dVar24 * v36;
    dVar247 = dVar457 * dVar26 * v34;
    dVar457 = dVar368 * dVar330 * dVar10;
    dVar698 = dVar457 * dVar24 * v36;
    dVar248 = dVar457 * dVar26 * v34;
    dVar457 = dVar368 * dVar330 * dVar11;
    dVar566 = dVar457 * dVar24 * v35;
    dVar426 = dVar457 * dVar25 * v34;
    dVar249 = dVar368 * dVar331;
    dVar250 = dVar249 * dVar10 * dVar26 * v33;
    dVar251 = dVar249 * dVar11 * dVar26 * v32;
    dVar457 = dVar368 * dVar332 * dVar11 * dVar24 * v33;
    dVar427 = dVar368 * dVar333 * dVar10 * dVar24 * v33;
    dVar252 = dVar368 * dVar333 * dVar11 * dVar24 * v32;
    dVar428 = dVar531 * dVar17;
    dVar561 = dVar428 * dVar28 * dVar10;
    dVar567 = dVar561 * dVar24 * v36;
    dVar777 = dVar561 * dVar26 * v34;
    dVar605 = dVar428 * dVar28 * dVar11;
    dVar561 = dVar605 * dVar24 * v35;
    dVar253 = dVar605 * dVar25 * v34;
    dVar605 = dVar428 * dVar330 * dVar10;
    dVar568 = dVar605 * dVar24 * v35;
    dVar778 = dVar605 * dVar25 * v34;
    dVar779 = dVar428 * dVar331;
    dVar751 = dVar779 * dVar10 * dVar25 * v33;
    dVar254 = dVar779 * dVar11 * dVar25 * v32;
    dVar605 = dVar428 * dVar332 * dVar10 * dVar24 * v33;
    dVar255 = dVar428 * dVar332 * dVar11 * dVar24 * v32;
    dVar256 = dVar428 * dVar333 * dVar10 * dVar24 * v32;
    dVar679 = dVar531 * dVar18;
    dVar699 = dVar679 * dVar28;
    dVar700 = dVar699 * dVar10 * dVar23 * v36;
    dVar257 = dVar699 * dVar11 * dVar22 * v36;
    dVar752 = dVar679 * dVar330;
    dVar258 = dVar752 * dVar10 * dVar23 * v35;
    dVar259 = dVar752 * dVar11 * dVar22 * v35;
    dVar260 = dVar679 * dVar332 * dVar10 * dVar23 * v33;
    dVar637 = dVar679 * dVar332 * dVar11 * dVar22 * v33;
    dVar261 = dVar679 * dVar333 * dVar10 * dVar23 * v32;
    dVar262 = dVar679 * dVar333 * dVar11 * dVar22 * v32;
    dVar679 = dVar610 * dVar28 * dVar11 * dVar23 * v34;
    dVar710 = dVar610 * dVar330 * dVar10 * dVar23 * v34;
    dVar263 = dVar610 * dVar330 * dVar11 * dVar22 * v34;
    dVar46 = dVar610 * dVar331 * dVar10 * dVar23 * v33;
    dVar610 = dVar610 * dVar331 * dVar11 * dVar23 * v32;
    dVar47 = dVar531 * dVar20;
    dVar48 = dVar47 * dVar28 * dVar10 * dVar23 * v34;
    dVar264 = dVar47 * dVar28 * dVar11 * dVar22 * v34;
    dVar49 = dVar47 * dVar330 * dVar10 * dVar22 * v34;
    dVar50 = dVar47 * dVar331 * dVar10 * dVar22 * v33;
    dVar265 = dVar47 * dVar331 * dVar11 * dVar22 * v32;
    dVar266 = dVar370 * dVar16 * dVar330 * dVar11 * dVar24 * v34;
    dVar662 = dVar662 * dVar11 * dVar24 * v33;
    dVar267 = dVar370 * dVar17 * dVar28 * dVar11 * dVar24 * v34;
    dVar370 = dVar370 * dVar17 * dVar331;
    dVar371 = dVar370 * dVar10 * dVar24 * v33;
    dVar268 = dVar370 * dVar11 * dVar24 * v32;
    dVar370 = dVar612 * dVar28 * dVar11 * dVar23 * v34;
    dVar372 = dVar612 * dVar330 * dVar10 * dVar23 * v34;
    dVar51 = dVar612 * dVar330 * dVar11 * dVar22 * v34;
    dVar612 = dVar612 * dVar331 * dVar11;
    dVar373 = dVar612 * dVar22 * v33;
    dVar613 = dVar612 * dVar23 * v32;
    dVar374 = dVar8 + dVar8;
    dVar612 = dVar374 * dVar16 * dVar330 * dVar10 * dVar24 * v34;
    dVar614 = dVar374 * dVar16 * dVar331;
    dVar52 = dVar614 * dVar10 * dVar24 * v33;
    dVar615 = dVar614 * dVar11 * dVar24 * v32;
    dVar614 = dVar374 * dVar17 * dVar28 * dVar10 * dVar24 * v34;
    dVar269 = dVar374 * dVar17 * dVar331;
    dVar270 = dVar269 * dVar10 * dVar24 * v32;
    dVar374 = dVar374 * dVar18;
    dVar616 = dVar374 * dVar28 * dVar10 * dVar23 * v34;
    dVar271 = dVar374 * dVar28 * dVar11 * dVar22 * v34;
    dVar272 = dVar374 * dVar330 * dVar10 * dVar22 * v34;
    dVar375 = dVar374 * dVar331 * dVar10;
    dVar53 = dVar375 * dVar22 * v33;
    dVar376 = dVar375 * dVar23 * v32;
    dVar467 = dVar712 * dVar331 * dVar12;
    dVar375 = dVar467 * dVar22 * local_1c58;
    dVar468 = dVar467 * dVar27 * v32;
    dVar713 = dVar712 * dVar334 * dVar12 * dVar22 * v34;
    dVar273 = dVar485 * dVar21 * dVar331 * dVar12 * dVar24 * v32;
    dVar274 = dVar84 * dVar12 * dVar26 * v33;
    dVar275 = dVar84 * dVar14 * dVar24 * v33;
    dVar84 = dVar692 * dVar12 * dVar23 * v36;
    dVar276 = dVar692 * dVar14 * dVar23 * v34;
    dVar88 = dVar87 * dVar23 * v33;
    dVar277 = dVar424 * dVar23 * v33;
    dVar87 = dVar249 * dVar10 * dVar24 * local_1c58;
    dVar278 = dVar249 * dVar15 * dVar24 * v32;
    dVar249 = dVar368 * dVar334 * dVar10 * dVar24 * v34;
    dVar368 = dVar428 * dVar330 * dVar11;
    dVar424 = dVar368 * dVar24 * v36;
    dVar368 = dVar368 * dVar26 * v34;
    dVar279 = dVar428 * dVar333 * dVar11 * dVar24 * v33;
    dVar280 = dVar699 * dVar10 * dVar27 * v34;
    dVar467 = dVar699 * dVar15 * dVar22 * v34;
    dVar47 = dVar47 * dVar330 * dVar11 * dVar23 * v34;
    dVar485 = dVar531 * dVar21 * dVar28 * dVar10 * dVar24 * v34;
    dVar281 = dVar269 * dVar11 * dVar24 * v33;
    dVar269 = dVar374 * dVar330 * dVar11 * dVar23 * v34;
    dVar692 = dVar9 + dVar9;
    dVar282 = dVar692 * dVar16 * dVar331 * dVar12 * dVar24 * v32;
    dVar283 = dVar692 * dVar18 * dVar28 * dVar12 * dVar22 * v34;
    dVar374 = dVar490 * dVar331 * dVar12;
    dVar284 = dVar374 * dVar23 * local_1c58;
    dVar374 = dVar374 * dVar27 * v33;
    dVar491 = dVar490 * dVar334 * dVar12 * dVar23 * v34;
    dVar643 = dVar642 * dVar21 * dVar331 * dVar12 * dVar24 * v33;
    dVar569 = dVar779 * dVar11 * dVar24 * local_1c58;
    dVar780 = dVar779 * dVar15 * dVar24 * v33;
    dVar429 = dVar428 * dVar334 * dVar11 * dVar24 * v34;
    dVar701 = dVar752 * dVar11 * dVar27 * v34;
    dVar753 = dVar752 * dVar15 * dVar23 * v34;
    dVar532 = dVar531 * dVar21 * dVar330 * dVar11 * dVar24 * v34;
    dVar285 = dVar692 * dVar17 * dVar331 * dVar12 * dVar24 * v33;
    dVar692 = dVar692 * dVar18 * dVar330 * dVar12 * dVar23 * v34;
    dVar428 = dVar4 * dVar16 * dVar330;
    dVar533 = dVar428 * dVar12 * dVar25 * v34;
    dVar492 = dVar428 * dVar13 * dVar24 * v34;
    dVar428 = dVar4 * dVar16 * dVar331;
    dVar570 = dVar428 * dVar12 * dVar25 * v33;
    dVar286 = dVar428 * dVar13 * dVar24 * v33;
    dVar287 = dVar4 * dVar17;
    dVar493 = dVar287 * dVar28 * dVar12 * dVar24 * v35;
    dVar377 = dVar287 * dVar28 * dVar13 * dVar24 * v34;
    dVar378 = dVar287 * dVar331 * dVar13 * dVar24 * v32;
    dVar288 = dVar287 * dVar332 * dVar12 * dVar24 * v32;
    dVar379 = dVar4 * dVar18;
    dVar494 = dVar379 * dVar28 * dVar12 * dVar23 * v35;
    dVar380 = dVar379 * dVar28 * dVar13 * dVar23 * v34;
    dVar289 = dVar379 * dVar330 * dVar13 * dVar22 * v34;
    dVar490 = dVar379 * dVar331 * dVar13;
    dVar428 = dVar490 * dVar22 * v33;
    dVar290 = dVar490 * dVar23 * v32;
    dVar291 = dVar379 * dVar332 * dVar12 * dVar23 * v32;
    dVar571 = dVar4 * dVar19 * dVar330 * dVar12 * dVar22 * v34;
    dVar292 = dVar4 * dVar19 * dVar331 * dVar12 * dVar22 * v33;
    dVar490 = dVar5 * dVar16;
    dVar531 = dVar490 * dVar28 * dVar12;
    dVar381 = dVar531 * dVar24 * v35;
    dVar531 = dVar531 * dVar25 * v34;
    dVar293 = dVar490 * dVar331 * dVar12;
    dVar294 = dVar293 * dVar25 * v32;
    dVar295 = dVar490 * dVar332 * dVar12 * dVar24 * v32;
    dVar572 = dVar5 * dVar18;
    dVar296 = dVar572 * dVar28 * dVar12;
    dVar297 = dVar296 * dVar22 * v35;
    dVar642 = dVar572 * dVar332 * dVar12 * dVar22 * v32;
    dVar298 = dVar5 * dVar19 * dVar28 * dVar12 * dVar22 * v34;
    dVar382 = dVar5 * dVar19 * dVar331 * dVar12 * dVar22 * v32;
    dVar702 = dVar6 * dVar16;
    dVar699 = dVar702 * dVar28 * dVar11;
    dVar383 = dVar699 * dVar24 * v35;
    dVar644 = dVar699 * dVar25 * v34;
    dVar645 = dVar702 * dVar330;
    dVar646 = dVar645 * dVar10 * dVar25 * v34;
    dVar384 = dVar702 * dVar331;
    dVar299 = dVar384 * dVar10 * dVar25 * v33;
    dVar385 = dVar384 * dVar11 * dVar25 * v32;
    dVar647 = dVar702 * dVar332 * dVar11 * dVar24 * v32;
    dVar664 = dVar6 * dVar17;
    dVar386 = dVar664 * dVar28;
    dVar387 = dVar386 * dVar10 * dVar24 * v35;
    dVar388 = dVar664 * dVar332 * dVar10 * dVar24 * v32;
    dVar389 = dVar6 * dVar18;
    dVar534 = dVar389 * dVar28;
    dVar754 = dVar534 * dVar10 * dVar23 * v35;
    dVar300 = dVar534 * dVar11 * dVar22 * v35;
    dVar301 = dVar389 * dVar332 * dVar10 * dVar23 * v32;
    dVar332 = dVar389 * dVar332 * dVar11 * dVar22 * v32;
    dVar699 = dVar6 * dVar19;
    dVar495 = dVar699 * dVar28 * dVar11 * dVar22 * v34;
    dVar496 = dVar699 * dVar330 * dVar10 * dVar22 * v34;
    dVar302 = dVar699 * dVar331 * dVar10 * dVar22 * v33;
    dVar699 = dVar699 * dVar331 * dVar11 * dVar22 * v32;
    dVar755 = dVar7 * dVar16 * dVar330 * dVar10 * dVar24 * v34;
    dVar712 = dVar7 * dVar16 * dVar331 * dVar10 * dVar24 * v33;
    dVar752 = dVar7 * dVar17 * dVar28 * dVar10 * dVar24 * v34;
    dVar303 = dVar7 * dVar17 * dVar331 * dVar10 * dVar24 * v32;
    dVar779 = dVar7 * dVar18;
    dVar756 = dVar779 * dVar28 * dVar10 * dVar23 * v34;
    dVar304 = dVar779 * dVar330 * dVar10 * dVar22 * v34;
    dVar779 = dVar779 * dVar331 * dVar10;
    dVar305 = dVar779 * dVar22 * v33;
    dVar497 = dVar779 * dVar23 * v32;
    dVar779 = dVar287 * dVar330 * dVar12;
    dVar757 = dVar779 * dVar24 * v36;
    dVar498 = dVar779 * dVar26 * v34;
    dVar617 = dVar287 * dVar331 * dVar12;
    dVar618 = dVar617 * dVar26 * v33;
    dVar499 = dVar287 * dVar333 * dVar12 * dVar24 * v33;
    dVar779 = dVar379 * dVar330 * dVar12;
    dVar54 = dVar779 * dVar23 * v36;
    dVar55 = dVar379 * dVar333 * dVar12 * dVar23 * v33;
    dVar619 = dVar4 * dVar20 * dVar330 * dVar12 * dVar23 * v34;
    dVar56 = dVar4 * dVar20 * dVar331 * dVar12 * dVar23 * v33;
    dVar500 = dVar490 * dVar330 * dVar12 * dVar24 * v36;
    dVar758 = dVar490 * dVar330 * dVar14 * dVar24 * v34;
    dVar306 = dVar490 * dVar331 * dVar14 * dVar24 * v33;
    dVar620 = dVar490 * dVar333 * dVar12 * dVar24 * v33;
    dVar621 = dVar5 * dVar17 * dVar28;
    dVar501 = dVar621 * dVar12 * dVar26 * v34;
    dVar622 = dVar621 * dVar14 * dVar24 * v34;
    dVar621 = dVar5 * dVar17 * dVar331;
    dVar623 = dVar621 * dVar12 * dVar26 * v32;
    dVar621 = dVar621 * dVar14 * dVar24 * v32;
    dVar573 = dVar572 * dVar28 * dVar14 * dVar23 * v34;
    dVar502 = dVar572 * dVar330 * dVar12 * dVar22 * v36;
    dVar57 = dVar572 * dVar330 * dVar14 * dVar22 * v34;
    dVar58 = dVar572 * dVar331 * dVar14;
    dVar307 = dVar58 * dVar22 * v33;
    dVar58 = dVar58 * dVar23 * v32;
    dVar59 = dVar572 * dVar333 * dVar12 * dVar22 * v33;
    dVar574 = dVar5 * dVar20 * dVar28 * dVar12 * dVar23 * v34;
    dVar308 = dVar5 * dVar20 * dVar331 * dVar12 * dVar23 * v32;
    dVar309 = dVar645 * dVar11 * dVar24 * v36;
    dVar575 = dVar702 * dVar333 * dVar11 * dVar24 * v33;
    dVar310 = dVar386 * dVar11 * dVar26 * v34;
    dVar311 = dVar664 * dVar330 * dVar10;
    dVar60 = dVar311 * dVar24 * v36;
    dVar312 = dVar311 * dVar26 * v34;
    dVar576 = dVar664 * dVar331;
    dVar503 = dVar576 * dVar10 * dVar26 * v33;
    dVar504 = dVar576 * dVar11 * dVar26 * v32;
    dVar313 = dVar664 * dVar333 * dVar10 * dVar24 * v33;
    dVar505 = dVar389 * dVar330;
    dVar314 = dVar505 * dVar10 * dVar23 * v36;
    dVar315 = dVar505 * dVar11 * dVar22 * v36;
    dVar311 = dVar389 * dVar333 * dVar10 * dVar23 * v33;
    dVar316 = dVar389 * dVar333 * dVar11 * dVar22 * v33;
    dVar333 = dVar6 * dVar20;
    dVar61 = dVar333 * dVar28 * dVar11 * dVar23 * v34;
    dVar62 = dVar333 * dVar330 * dVar10 * dVar23 * v34;
    dVar317 = dVar333 * dVar331 * dVar10 * dVar23 * v33;
    dVar318 = dVar333 * dVar331 * dVar11 * dVar23 * v32;
    dVar319 = dVar8 * dVar16 * dVar330 * dVar11 * dVar24 * v34;
    dVar333 = dVar8 * dVar16 * dVar331 * dVar11 * dVar24 * v33;
    dVar63 = dVar8 * dVar17 * dVar28 * dVar11 * dVar24 * v34;
    dVar64 = dVar8 * dVar17 * dVar331 * dVar11 * dVar24 * v32;
    dVar320 = dVar8 * dVar18;
    dVar321 = dVar320 * dVar28 * dVar11 * dVar23 * v34;
    dVar65 = dVar320 * dVar330 * dVar11 * dVar22 * v34;
    dVar320 = dVar320 * dVar331 * dVar11;
    dVar66 = dVar320 * dVar22 * v33;
    dVar322 = dVar320 * dVar23 * v32;
    dVar617 = dVar617 * dVar24 * local_1c58;
    dVar320 = dVar287 * dVar334 * dVar12 * dVar24 * v34;
    dVar323 = dVar779 * dVar27 * v34;
    dVar779 = dVar379 * dVar331 * dVar12;
    dVar324 = dVar779 * dVar23 * local_1c58;
    dVar325 = dVar779 * dVar27 * v33;
    dVar779 = dVar379 * dVar334 * dVar12 * dVar23 * v34;
    dVar326 = dVar4 * dVar21 * dVar330 * dVar12 * dVar24 * v34;
    dVar430 = dVar4 * dVar21 * dVar331 * dVar12 * dVar24 * v33;
    dVar327 = dVar293 * dVar24 * local_1c58;
    dVar490 = dVar490 * dVar334 * dVar12 * dVar24 * v34;
    dVar328 = dVar296 * dVar27 * v34;
    dVar287 = dVar572 * dVar331 * dVar12;
    dVar431 = dVar287 * dVar22 * local_1c58;
    dVar287 = dVar287 * dVar27 * v32;
    dVar572 = dVar572 * dVar334 * dVar12 * dVar22 * v34;
    dVar432 = dVar5 * dVar21 * dVar28 * dVar12 * dVar24 * v34;
    dVar293 = dVar5 * dVar21 * dVar331 * dVar12 * dVar24 * v32;
    dVar645 = dVar645 * dVar15 * dVar24 * v34;
    dVar296 = dVar384 * dVar11 * dVar24 * local_1c58;
    dVar329 = dVar384 * dVar15 * dVar24 * v33;
    dVar703 = dVar702 * dVar334 * dVar11 * dVar24 * v34;
    dVar702 = dVar386 * dVar15 * dVar24 * v34;
    dVar759 = dVar576 * dVar10 * dVar24 * local_1c58;
    dVar577 = dVar576 * dVar15 * dVar24 * v32;
    dVar665 = dVar664 * dVar334 * dVar10 * dVar24 * v34;
    dVar648 = dVar534 * dVar11 * dVar27 * v34;
    dVar535 = dVar534 * dVar15 * dVar23 * v34;
    dVar624 = dVar505 * dVar10 * dVar27 * v34;
    dVar506 = dVar505 * dVar15 * dVar22 * v34;
    dVar379 = dVar389 * dVar331;
    dVar578 = dVar379 * dVar10 * dVar23 * local_1c58;
    dVar536 = dVar379 * dVar10 * dVar27 * v33;
    dVar625 = dVar379 * dVar11 * dVar22 * local_1c58;
    dVar537 = dVar379 * dVar11 * dVar27 * v32;
    dVar576 = dVar379 * dVar15 * dVar22 * v33;
    dVar507 = dVar379 * dVar15 * dVar23 * v32;
    dVar505 = dVar389 * dVar334 * dVar10 * dVar23 * v34;
    dVar534 = dVar389 * dVar334 * dVar11 * dVar22 * v34;
    dVar384 = dVar6 * dVar21;
    dVar334 = dVar384 * dVar28 * dVar11 * dVar24 * v34;
    dVar379 = dVar384 * dVar330 * dVar10 * dVar24 * v34;
    dVar389 = dVar384 * dVar331 * dVar10 * dVar24 * v33;
    dVar781 = dVar384 * dVar331 * dVar11 * dVar24 * v32;
    dVar714 = dVar9 * dVar16 * dVar330 * dVar12 * dVar24 * v34;
    dVar626 = dVar9 * dVar16 * dVar331 * dVar12 * dVar24 * v33;
    dVar386 = dVar9 * dVar17 * dVar28 * dVar12 * dVar24 * v34;
    dVar627 = dVar9 * dVar17 * dVar331 * dVar12 * dVar24 * v32;
    dVar384 = dVar9 * dVar18;
    dVar664 = dVar384 * dVar28 * dVar12 * dVar23 * v34;
    dVar628 = dVar384 * dVar330 * dVar12 * dVar22 * v34;
    dVar28 = dVar384 * dVar331 * dVar12;
    dVar330 = dVar28 * dVar22 * v33;
    dVar28 = dVar28 * dVar23 * v32;
    Eigen::Matrix<double,_5,_1,_0,_5,_1>::Matrix
              ((Matrix<double,_5,_1,_0,_5,_1> *)
               &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pSVar95 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                         &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0,0);
    *pSVar95 = (dVar150 +
               dVar437 + ((((dVar593 +
                            dVar706 + dVar761 + (((dVar343 +
                                                  ((dVar147 +
                                                   ((dVar393 +
                                                    dVar521 + (((dVar542 +
                                                                dVar591 + (((dVar471 +
                                                                            dVar631 + ((dVar654 +
                                                                                       (((dVar718 +
                                                                                         ((dVar145 +
                                                                                          dVar392 + 
                                                  dVar587 + ((dVar144 +
                                                             ((dVar103 +
                                                              (((((dVar141 +
                                                                  ((dVar649 +
                                                                   ((dVar139 +
                                                                    dVar134 + dVar138 + (((dVar135 +
                                                                                          dVar36 + 
                                                  dVar133 + ((((dVar34 + dVar131 + ((dVar31 + ((
                                                  dVar126 + ((((dVar589 +
                                                               dVar127 + (((dVar670 +
                                                                           dVar124 + (((dVar121 +
                                                                                       dVar122 + (((
                                                  dVar118 + dVar588 + dVar119 + ((dVar782 +
                                                                                 ((dVar652 +
                                                                                  (((dVar760 +
                                                                                    dVar516 + 
                                                  dVar715 + ((((dVar650 +
                                                               dVar668 + ((dVar514 +
                                                                          (((dVar115 +
                                                                            dVar580 + dVar114 + ((((
                                                  dVar667 + dVar112 + ((dVar511 +
                                                                       ((dVar106 +
                                                                        ((((dVar510 +
                                                                           ((dVar342 +
                                                                            dVar109 + ((dVar716 +
                                                                                       (((dVar508 +
                                                                                         dVar104 + 
                                                  dVar469 + (((dVar102 +
                                                              dVar340 + dVar390 + ((dVar583 +
                                                                                   (((dVar101 +
                                                                                     (((dVar338 +
                                                                                       dVar435 + (((
                                                  dVar337 + (dVar434 - dVar336)) - dVar98) - dVar539
                                                  )) - dVar100) - dVar391)) - dVar339) - dVar335)) -
                                                  dVar582)) - dVar433) - dVar586)) - dVar341) -
                                                  dVar105)) - dVar107)) - dVar110)) - dVar344) -
                                                  dVar345) - dVar470)) - dVar666)) - dVar111)) -
                                                  dVar538) - dVar579) - dVar113)) - dVar629) -
                                                  dVar512)) - dVar116)) - dVar515) - dVar704) -
                                                  dVar705)) - dVar651) - dVar117)) - dVar669)) -
                                                  dVar653)) - dVar120) - dVar517)) - dVar518) -
                                                  dVar123)) - dVar125) - dVar29)) - dVar128) -
                                                  dVar129) - dVar130)) - dVar30)) - dVar33)) -
                                                  dVar132) - dVar32) - dVar35)) - dVar136) - dVar137
                                                  )) - dVar513)) - dVar140)) - dVar99) - dVar581) -
                                                  dVar585) - dVar584)) - dVar143)) - dVar142)) -
                                                  dVar108)) - dVar509) - dVar146)) - dVar672)) -
                                                  dVar541) - dVar519)) - dVar520) - dVar592)) -
                                                  dVar472)) - dVar347)) - dVar148) - dVar149)) -
                           dVar67) - dVar707) - dVar436)) - dVar346;
    pSVar95 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                         &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,1,0);
    *pSVar95 = (dVar204 +
               dVar523 + ((dVar677 +
                          ((dVar772 +
                           (((dVar480 +
                             ((dVar203 +
                              ((dVar201 +
                               dVar200 + ((dVar594 +
                                          (((dVar555 +
                                            dVar196 + ((dVar708 +
                                                       ((dVar194 +
                                                        ((dVar74 + ((dVar193 +
                                                                    (((dVar543 +
                                                                      ((dVar709 +
                                                                       ((dVar450 +
                                                                        dVar354 + (((dVar186 +
                                                                                    dVar447 + 
                                                  dVar599 + dVar189 + (((((dVar349 +
                                                                          dVar351 + dVar443 + (((((
                                                  dVar444 + dVar184 + ((dVar596 +
                                                                       dVar183 + (((dVar595 +
                                                                                   ((((dVar767 +
                                                                                      dVar180 + (((
                                                  dVar178 + dVar177 + (((dVar676 +
                                                                        ((dVar174 +
                                                                         dVar733 + ((dVar473 +
                                                                                    dVar559 + (((
                                                  dVar770 + ((dVar171 +
                                                             dVar674 + dVar402 + ((dVar170 +
                                                                                  (((dVar401 +
                                                                                    ((dVar557 +
                                                                                     dVar673 + ((((
                                                  dVar166 + dVar72 + dVar396 + dVar556 + (((dVar165 
                                                  + (((dVar553 +
                                                      dVar163 + dVar551 + (((dVar730 +
                                                                            ((dVar478 +
                                                                             ((dVar161 +
                                                                              ((((dVar477 +
                                                                                 dVar727 + ((dVar70 
                                                  + dVar476 + ((dVar545 +
                                                               dVar160 + dVar475 + (((((dVar159 +
                                                                                       ((dVar633 +
                                                                                        dVar69 + 
                                                  dVar723 + ((((dVar632 +
                                                               ((dVar158 +
                                                                (((dVar768 +
                                                                  dVar156 + dVar766 + (((dVar765 +
                                                                                        dVar540 + ((
                                                  dVar655 + ((dVar719 +
                                                             (((dVar763 +
                                                               ((dVar440 +
                                                                dVar348 + ((dVar439 +
                                                                           ((dVar394 - dVar151) -
                                                                           dVar438)) - dVar395)) -
                                                               dVar152)) - dVar441) - dVar153)) -
                                                            dVar764)) - dVar154)) - dVar155) -
                                                  dVar590)) - dVar630) - dVar157)) - dVar721)) -
                                                  dVar68) - dVar769) - dVar722)) - dVar724)) -
                                                  dVar725) - dVar634) - dVar544) - dVar474)) -
                                                  dVar726)) - dVar546)) - dVar728) - dVar547) -
                                                  dVar548)) - dVar549)) - dVar162)) - dVar71) -
                                                  dVar550)) - dVar164) - dVar731)) - dVar732) -
                                                  dVar554)) - dVar397) - dVar398) - dVar399)) -
                                                  dVar400)) - dVar167) - dVar169)) - dVar671)) -
                                                  dVar717)) - dVar558) - dVar172)) - dVar173)) -
                                                  dVar734)) - dVar175) - dVar176)) - dVar720) -
                                                  dVar179)) - dVar37) - dVar38) - dVar181)) - dVar39
                                                  ) - dVar182)) - dVar40)) - dVar185) - dVar597) -
                                                  dVar442) - dVar350)) - dVar187) - dVar445) -
                                                  dVar446) - dVar188)) - dVar448) - dVar449)) -
                                                  dVar190)) - dVar353)) - dVar191) - dVar192)) -
                                                  dVar552)) - dVar73)) - dVar168)) - dVar195)) -
                                           dVar197) - dVar198)) - dVar199)) - dVar202)) - dVar352))
                            - dVar636) - dVar560)) - dVar404)) - dVar736)) - dVar598;
    pSVar95 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                         &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,2,0);
    *pSVar95 = (dVar243 +
               ((dVar460 +
                dVar638 + (((dVar452 +
                            ((dVar412 +
                             dVar484 + (((dVar530 +
                                         ((dVar606 +
                                          dVar458 + dVar411 + (((((dVar482 +
                                                                  dVar562 + dVar773 + dVar660 + ((((
                                                  dVar743 + ((dVar774 +
                                                             (((dVar240 +
                                                               dVar239 + dVar211 + dVar238 + (((
                                                  dVar236 + ((dVar234 +
                                                             dVar233 + (((dVar232 +
                                                                         ((dVar230 +
                                                                          dVar229 + ((((dVar227 +
                                                                                       dVar226 + 
                                                  dVar45 + ((((dVar225 +
                                                              (((dVar678 +
                                                                dVar407 + dVar222 + (((dVar219 +
                                                                                      ((dVar658 +
                                                                                       dVar217 + ((
                                                  dVar215 + ((dVar659 +
                                                             ((((dVar75 + dVar739 + (((dVar213 +
                                                                                      dVar738 + 
                                                  dVar41 + ((dVar737 +
                                                            dVar210 + ((((dVar359 +
                                                                         dVar729 + ((dVar358 +
                                                                                    ((dVar635 +
                                                                                     ((dVar602 +
                                                                                      (((dVar208 +
                                                                                        dVar403 + ((
                                                  ((dVar456 +
                                                   dVar526 + dVar357 + ((((dVar406 +
                                                                          dVar525 + ((dVar453 +
                                                                                     dVar481 + ((
                                                  dVar405 - dVar524) - dVar451)) - dVar205)) -
                                                  dVar455) - dVar355) - dVar356)) - dVar207) -
                                                  dVar527) - dVar528)) - dVar408) - dVar479)) -
                                                  dVar522)) - dVar603)) - dVar604)) - dVar735) -
                                                  dVar762) - dVar771)) - dVar212)) - dVar42) -
                                                  dVar657)) - dVar740) - dVar741) - dVar43)) -
                                                  dVar214)) - dVar216)) - dVar218)) - dVar220) -
                                                  dVar221)) - dVar223) - dVar224)) - dVar206) -
                                                  dVar454) - dVar44)) - dVar409) - dVar601) -
                                                  dVar228)) - dVar231)) - dVar675) - dVar209)) -
                                                  dVar600)) - dVar235) - dVar237)) - dVar360) -
                                                  dVar656)) - dVar742)) - dVar76) - dVar77) - dVar78
                                                  )) - dVar241) - dVar711) - dVar680) - dVar529)) -
                                         dVar362)) - dVar483) - dVar607)) - dVar459)) - dVar364) -
                          dVar242)) - dVar639)) - dVar363;
    pSVar95 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                         &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,3,0);
    *pSVar95 = (dVar285 +
               dVar532 + ((dVar701 +
                          ((dVar780 +
                           (((dVar491 +
                             ((dVar284 +
                              ((dVar282 +
                               ((dVar281 +
                                dVar485 + dVar47 + ((dVar280 +
                                                    ((dVar368 +
                                                     (((dVar278 +
                                                       (((dVar88 + ((dVar84 + dVar275 + (((dVar713 +
                                                                                          ((dVar375 
                                                  + dVar376 + ((dVar272 +
                                                               ((((dVar614 +
                                                                  dVar615 + dVar52 + (((dVar373 +
                                                                                       (((dVar370 +
                                                                                         dVar268 + 
                                                  dVar371 + (((dVar266 +
                                                              ((dVar50 + ((dVar264 +
                                                                          dVar48 + dVar610 + ((
                                                  dVar263 + dVar710 + ((dVar262 +
                                                                       (((dVar260 +
                                                                         dVar259 + (((dVar700 +
                                                                                     dVar256 + ((((
                                                  dVar751 + ((dVar568 +
                                                             dVar253 + ((dVar777 +
                                                                        ((((dVar457 +
                                                                           dVar251 + ((dVar426 +
                                                                                      ((dVar248 +
                                                                                       (((dVar565 +
                                                                                         dVar425 + (
                                                  (((dVar564 +
                                                    ((dVar695 +
                                                     dVar86 + dVar421 + ((dVar694 +
                                                                         ((((dVar420 +
                                                                            dVar748 + ((dVar85 + 
                                                  dVar419 + ((dVar488 +
                                                             ((dVar418 +
                                                              dVar688 + ((((dVar747 +
                                                                           dVar686 + ((((dVar416 +
                                                                                        dVar640 + ((
                                                  dVar415 + dVar685 + (((dVar745 +
                                                                        (((dVar82 + dVar682 + 
                                                  dVar744 + (((dVar465 +
                                                              dVar776 + dVar464 + (((dVar463 +
                                                                                    (((dVar775 +
                                                                                      ((dVar244 +
                                                                                       dVar361 + (((
                                                  dVar663 + dVar611 + ((dVar369 +
                                                                       (((dVar608 +
                                                                         ((dVar563 +
                                                                          (dVar365 - dVar413)) -
                                                                         dVar366)) - dVar367) -
                                                                       dVar661)) - dVar609)) -
                                                  dVar79) - dVar80)) - dVar461)) - dVar462) -
                                                  dVar245)) - dVar410) - dVar246)) - dVar81) -
                                                  dVar681)) - dVar683) - dVar466)) - dVar684) -
                                                  dVar414)) - dVar486)) - dVar641) - dVar487) -
                                                  dVar746)) - dVar417) - dVar83) - dVar687)) -
                                                  dVar689)) - dVar690)) - dVar489)) - dVar749) -
                                                  dVar691) - dVar693)) - dVar750)) - dVar422)) -
                                                  dVar696) - dVar423) - dVar697)) - dVar247) -
                                                  dVar698)) - dVar566)) - dVar250)) - dVar427) -
                                                  dVar252) - dVar567)) - dVar561)) - dVar778)) -
                                                  dVar254) - dVar605) - dVar255)) - dVar257) -
                                                  dVar258)) - dVar637) - dVar261)) - dVar679)) -
                                                  dVar46)) - dVar49)) - dVar265)) - dVar662) -
                                                  dVar267)) - dVar372) - dVar51)) - dVar613) -
                                                  dVar612)) - dVar270) - dVar616) - dVar271)) -
                                                  dVar53)) - dVar468)) - dVar273) - dVar274)) -
                                                  dVar276)) - dVar277) - dVar87)) - dVar249) -
                                                  dVar424)) - dVar279)) - dVar467)) - dVar269)) -
                              dVar283)) - dVar374)) - dVar643) - dVar569)) - dVar429)) - dVar753)) -
               dVar692;
    pSVar95 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                         &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,4,0);
    *pSVar95 = (dVar330 +
               ((dVar664 +
                dVar627 + (((dVar714 +
                            dVar781 + ((dVar379 +
                                       (((dVar505 +
                                         ((dVar576 +
                                          dVar537 + (((dVar578 +
                                                      ((dVar624 +
                                                       dVar535 + (((dVar577 +
                                                                   (((dVar703 +
                                                                     ((dVar296 +
                                                                      dVar645 + ((dVar432 +
                                                                                 dVar572 + ((dVar431
                                                                                            + 
                                                  dVar328 + (((dVar430 +
                                                              (((dVar325 +
                                                                (((dVar320 +
                                                                  dVar617 + ((dVar66 + ((dVar321 +
                                                                                        dVar64 + (((
                                                  dVar319 + dVar318 + ((dVar62 + (((dVar311 +
                                                                                   ((dVar314 +
                                                                                    ((dVar504 +
                                                                                     ((dVar312 +
                                                                                      (((dVar575 +
                                                                                        dVar309 + ((
                                                  dVar574 + dVar59 + ((dVar307 +
                                                                      ((dVar502 +
                                                                       dVar573 + dVar621 + (((
                                                  dVar501 + (((dVar758 +
                                                              ((dVar56 + ((((dVar499 +
                                                                            dVar618 + ((dVar757 +
                                                                                       ((dVar305 +
                                                                                        ((dVar756 +
                                                                                         dVar303 + (
                                                  ((dVar755 +
                                                   dVar699 + ((dVar496 +
                                                              (((dVar301 +
                                                                ((dVar754 +
                                                                 (((dVar647 +
                                                                   dVar385 + ((dVar646 +
                                                                              ((dVar383 +
                                                                               ((dVar298 +
                                                                                dVar642 + dVar297 + 
                                                  (((dVar531 +
                                                    ((dVar292 +
                                                     ((((dVar428 +
                                                        ((dVar380 +
                                                         ((dVar288 +
                                                          dVar378 + ((dVar493 +
                                                                     ((dVar570 + (dVar492 - dVar533)
                                                                      ) - dVar286)) - dVar377)) -
                                                         dVar494)) - dVar289)) - dVar290) - dVar291)
                                                     - dVar571)) - dVar381)) - dVar294) - dVar295))
                                                  - dVar382)) - dVar644)) - dVar299)) - dVar387) -
                                                  dVar388)) - dVar300)) - dVar332) - dVar495)) -
                                                  dVar302)) - dVar712) - dVar752)) - dVar304)) -
                                                  dVar497)) - dVar498)) - dVar54) - dVar55) -
                                                  dVar619)) - dVar500)) - dVar306) - dVar620)) -
                                                  dVar622) - dVar623)) - dVar57)) - dVar58)) -
                                                  dVar308)) - dVar310) - dVar60)) - dVar503)) -
                                                  dVar313)) - dVar315)) - dVar316) - dVar61)) -
                                                  dVar317)) - dVar333) - dVar63)) - dVar65)) -
                                                  dVar322)) - dVar323) - dVar324)) - dVar779) -
                                                  dVar326)) - dVar327) - dVar490)) - dVar287)) -
                                                  dVar293)) - dVar329)) - dVar702) - dVar759)) -
                                                  dVar665) - dVar648)) - dVar506)) - dVar536) -
                                                  dVar625)) - dVar507)) - dVar534) - dVar334)) -
                                      dVar389)) - dVar626) - dVar386)) - dVar628)) - dVar28;
    o4_roots<double>((vector<double,_std::allocator<double>_> *)&s,
                     (Matrix<double,_5,_1,_0,_5,_1> *)
                     &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)&numSolutions);
    iter._3_1_ = 0;
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::vector(__return_storage_ptr__);
    sVar89 = std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)&s);
    local_1da0 = (uint)sVar89;
    for (local_1da4 = 0; local_1da4 < local_1da0; local_1da4 = local_1da4 + 1) {
      pvVar96 = std::vector<double,_std::allocator<double>_>::back
                          ((vector<double,_std::allocator<double>_> *)&s);
      sTheta1 = *pvVar96;
      std::vector<double,_std::allocator<double>_>::pop_back
                ((vector<double,_std::allocator<double>_> *)&s);
      b = (1.0 - sTheta1 * sTheta1) / (sTheta1 * sTheta1 + 1.0);
      shouldBeZero1 = (sTheta1 + sTheta1) / (sTheta1 * sTheta1 + 1.0);
      dVar782 = dVar6 * dVar18;
      dVar704 = b * dVar4 * dVar18;
      dVar331 = b * dVar6;
      dVar760 = dVar331 * dVar16;
      dVar508 = b * dVar5 * dVar18;
      dVar433 = dVar331 * dVar17 * dVar10;
      dVar705 = dVar704 * dVar12;
      dVar513 = shouldBeZero1 * dVar4 * dVar18;
      dVar579 = shouldBeZero1 * dVar5 * dVar18;
      dVar629 = shouldBeZero1 * dVar6;
      dVar715 = dVar629 * dVar16 * dVar10;
      dVar512 = dVar629 * dVar17;
      dVar580 = dVar579 * dVar12;
      dVar28 = b * b;
      dVar106 = dVar28 * dVar4;
      dVar469 = dVar106 * dVar17 * dVar12;
      dVar538 = dVar28 * dVar5 * dVar16;
      dVar332 = shouldBeZero1 * shouldBeZero1;
      dVar333 = dVar332 * dVar4 * dVar17;
      dVar582 = dVar332 * dVar5;
      dVar390 = dVar582 * dVar16 * dVar12;
      dVar330 = b * shouldBeZero1;
      dVar334 = dVar330 * dVar4;
      dVar335 = dVar330 * dVar5;
      ty = -((dVar335 * dVar20 * dVar12 * dVar23 +
             ((dVar335 * dVar17 * dVar12 * dVar26 +
              (((dVar330 * dVar7 * dVar16 * dVar11 * dVar24 +
                dVar335 * dVar19 * dVar12 * dVar22 +
                ((dVar335 * dVar16 * dVar12 * dVar25 +
                 dVar334 * dVar20 * dVar12 * dVar22 +
                 (((dVar334 * dVar17 * dVar12 * dVar25 +
                   dVar334 * dVar16 * dVar14 * dVar24 +
                   ((dVar332 * dVar8 * dVar17 * dVar10 * dVar24 +
                    (((dVar582 * dVar19 * dVar12 * dVar23 +
                      dVar582 * dVar17 * dVar13 * dVar24 +
                      ((dVar390 * dVar26 +
                       ((dVar28 * dVar8 * dVar16 * dVar11 * dVar24 +
                        dVar538 * dVar14 * dVar24 +
                        (((dVar28 * dVar7 * dVar16 * dVar10 * dVar24 +
                          ((dVar106 * dVar16 * dVar13 * dVar24 +
                           ((((shouldBeZero1 * dVar5 * dVar21 * dVar12 * dVar24 +
                              dVar580 * dVar27 +
                              shouldBeZero1 * dVar8 * dVar18 * dVar10 * dVar22 +
                              (((dVar629 * dVar19 * dVar10 * dVar23 +
                                ((dVar715 * dVar26 +
                                 dVar579 * dVar13 * dVar22 +
                                 ((b * dVar9 * dVar16 * dVar12 * dVar24 +
                                  dVar760 * dVar15 * dVar24 +
                                  ((((dVar331 * dVar20 * dVar10 * dVar23 +
                                     dVar433 * dVar26 +
                                     (((dVar331 * dVar19 * dVar10 * dVar22 +
                                       dVar760 * dVar10 * dVar25 +
                                       (((dVar6 * dVar21 * dVar10 * dVar24 +
                                         (dVar782 * dVar10 * dVar27 - dVar782 * dVar15 * dVar22)) -
                                        dVar9 * dVar18 * dVar12 * dVar22) -
                                       dVar704 * dVar13 * dVar22)) -
                                      b * dVar7 * dVar18 * dVar10 * dVar22) -
                                     dVar508 * dVar14 * dVar22)) -
                                    b * dVar8 * dVar18 * dVar11 * dVar22) - dVar705 * dVar27) -
                                  b * dVar4 * dVar21 * dVar12 * dVar24)) - dVar513 * dVar14 * dVar22
                                 )) - dVar512 * dVar10 * dVar25)) -
                               dVar629 * dVar20 * dVar10 * dVar22) -
                              shouldBeZero1 * dVar7 * dVar18 * dVar11 * dVar22)) -
                             dVar512 * dVar15 * dVar24) -
                            shouldBeZero1 * dVar9 * dVar17 * dVar12 * dVar24) -
                           dVar106 * dVar16 * dVar12 * dVar25)) - dVar106 * dVar19 * dVar12 * dVar22
                          )) - dVar469 * dVar26) - dVar106 * dVar20 * dVar12 * dVar23)) -
                       dVar333 * dVar14 * dVar24)) - dVar582 * dVar17 * dVar12 * dVar25)) -
                     dVar582 * dVar20 * dVar12 * dVar22) -
                    dVar332 * dVar7 * dVar17 * dVar11 * dVar24)) -
                   dVar334 * dVar16 * dVar12 * dVar26)) - dVar334 * dVar17 * dVar13 * dVar24) -
                 dVar334 * dVar19 * dVar12 * dVar23)) - dVar335 * dVar16 * dVar13 * dVar24)) -
               dVar330 * dVar7 * dVar17 * dVar10 * dVar24) -
              dVar330 * dVar8 * dVar16 * dVar10 * dVar24)) - dVar335 * dVar17 * dVar14 * dVar24)) -
            dVar330 * dVar8 * dVar17 * dVar11 * dVar24) /
           ((dVar333 * dVar12 * dVar24 +
            ((dVar469 * dVar24 +
             ((dVar580 * dVar23 +
              ((dVar513 * dVar12 * dVar22 +
               ((dVar760 * dVar11 * dVar24 +
                dVar508 * dVar12 * dVar22 +
                ((dVar782 * dVar10 * dVar23 - dVar782 * dVar11 * dVar22) - dVar705 * dVar23)) -
               dVar433 * dVar24)) - dVar715 * dVar24)) - dVar512 * dVar11 * dVar24)) -
            dVar538 * dVar12 * dVar24)) - dVar390 * dVar24);
      dVar508 = dVar6 * dVar18;
      dVar704 = b * dVar4 * dVar18;
      dVar28 = b * dVar6;
      dVar760 = dVar28 * dVar16 * dVar11;
      dVar433 = b * dVar5 * dVar18;
      dVar782 = dVar28 * dVar17;
      dVar469 = dVar433 * dVar12;
      dVar512 = shouldBeZero1 * dVar4 * dVar18;
      dVar580 = shouldBeZero1 * dVar5 * dVar18;
      dVar705 = shouldBeZero1 * dVar6;
      dVar715 = dVar705 * dVar16;
      dVar629 = dVar705 * dVar17 * dVar11;
      dVar513 = dVar512 * dVar12;
      dVar106 = b * b;
      dVar538 = dVar106 * dVar4 * dVar17;
      dVar334 = dVar106 * dVar5;
      dVar579 = dVar334 * dVar16 * dVar12;
      dVar335 = shouldBeZero1 * shouldBeZero1;
      dVar582 = dVar335 * dVar4;
      dVar330 = dVar582 * dVar17 * dVar12;
      dVar390 = dVar335 * dVar5 * dVar16;
      dVar332 = b * shouldBeZero1;
      dVar333 = dVar332 * dVar4;
      dVar331 = dVar332 * dVar5;
      a = -((dVar332 * dVar8 * dVar16 * dVar11 * dVar24 +
            dVar332 * dVar7 * dVar17 * dVar11 * dVar24 +
            dVar331 * dVar20 * dVar12 * dVar22 +
            (((dVar331 * dVar17 * dVar12 * dVar25 +
              dVar331 * dVar16 * dVar14 * dVar24 +
              (((dVar333 * dVar17 * dVar14 * dVar24 +
                ((dVar332 * dVar7 * dVar16 * dVar10 * dVar24 +
                 ((dVar333 * dVar16 * dVar13 * dVar24 +
                  (((dVar335 * dVar7 * dVar16 * dVar11 * dVar24 +
                    ((dVar582 * dVar20 * dVar12 * dVar22 +
                     ((dVar330 * dVar25 +
                      dVar582 * dVar16 * dVar14 * dVar24 +
                      ((dVar106 * dVar8 * dVar17 * dVar11 * dVar24 +
                       ((dVar334 * dVar17 * dVar14 * dVar24 +
                        ((dVar106 * dVar7 * dVar17 * dVar10 * dVar24 +
                         (((dVar538 * dVar13 * dVar24 +
                           shouldBeZero1 * dVar9 * dVar16 * dVar12 * dVar24 +
                           dVar715 * dVar15 * dVar24 +
                           (((shouldBeZero1 * dVar8 * dVar18 * dVar10 * dVar23 +
                             (((dVar705 * dVar19 * dVar11 * dVar23 +
                               ((dVar715 * dVar11 * dVar26 +
                                dVar580 * dVar13 * dVar23 +
                                ((b * dVar9 * dVar17 * dVar12 * dVar24 +
                                 dVar782 * dVar15 * dVar24 +
                                 ((((dVar28 * dVar20 * dVar11 * dVar23 +
                                    dVar782 * dVar11 * dVar26 +
                                    (((dVar28 * dVar19 * dVar11 * dVar22 +
                                      dVar760 * dVar25 +
                                      (((dVar6 * dVar21 * dVar11 * dVar24 +
                                        (dVar508 * dVar11 * dVar27 - dVar508 * dVar15 * dVar23)) -
                                       dVar9 * dVar18 * dVar12 * dVar23) - dVar704 * dVar13 * dVar23
                                      )) - b * dVar7 * dVar18 * dVar10 * dVar23) -
                                    dVar433 * dVar14 * dVar23)) -
                                   b * dVar8 * dVar18 * dVar11 * dVar23) - dVar469 * dVar27) -
                                 b * dVar5 * dVar21 * dVar12 * dVar24)) - dVar512 * dVar14 * dVar23)
                                ) - dVar629 * dVar25)) - dVar705 * dVar20 * dVar11 * dVar22) -
                             shouldBeZero1 * dVar7 * dVar18 * dVar11 * dVar23)) - dVar513 * dVar27)
                           - shouldBeZero1 * dVar4 * dVar21 * dVar12 * dVar24)) - dVar579 * dVar25)
                         - dVar334 * dVar19 * dVar12 * dVar22)) - dVar334 * dVar17 * dVar12 * dVar26
                        )) - dVar334 * dVar20 * dVar12 * dVar23)) -
                      dVar582 * dVar16 * dVar12 * dVar26)) - dVar582 * dVar19 * dVar12 * dVar23)) -
                    dVar390 * dVar13 * dVar24)) - dVar335 * dVar8 * dVar16 * dVar10 * dVar24) -
                  dVar333 * dVar16 * dVar12 * dVar25)) - dVar333 * dVar19 * dVar12 * dVar22)) -
                dVar333 * dVar17 * dVar12 * dVar26)) - dVar333 * dVar20 * dVar12 * dVar23) -
              dVar331 * dVar16 * dVar12 * dVar26)) - dVar331 * dVar17 * dVar13 * dVar24) -
            dVar331 * dVar19 * dVar12 * dVar23)) - dVar332 * dVar8 * dVar17 * dVar10 * dVar24) /
          ((dVar330 * dVar24 +
           ((dVar538 * dVar12 * dVar24 +
            ((dVar580 * dVar12 * dVar23 +
             ((dVar513 * dVar22 +
              ((dVar760 * dVar24 +
               dVar469 * dVar22 +
               ((dVar508 * dVar10 * dVar23 - dVar508 * dVar11 * dVar22) - dVar704 * dVar12 * dVar23)
               ) - dVar782 * dVar10 * dVar24)) - dVar715 * dVar10 * dVar24)) - dVar629 * dVar24)) -
           dVar579 * dVar24)) - dVar390 * dVar12 * dVar24);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator<<
                (&local_1dc8,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&numSolutions,&b);
      local_1dd0 = -shouldBeZero1;
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (&local_1dc8,&local_1dd0);
      local_1dd8 = 0.0;
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&local_1dd8);
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&ty);
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&shouldBeZero1);
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&b);
      local_1de0 = 0.0;
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&local_1de0);
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&a);
      local_1de8 = 0.0;
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&local_1de8);
      local_1df0 = 0.0;
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&local_1df0);
      local_1df8 = 1.0;
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&local_1df8);
      local_1e00 = 0.0;
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&local_1e00);
      local_1e08 = 0.0;
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&local_1e08);
      local_1e10 = 0.0;
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&local_1e10);
      local_1e18 = 0.0;
      pCVar97 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar97,&local_1e18);
      local_1e20 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar97,&local_1e20)
      ;
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::~CommaInitializer(&local_1dc8)
      ;
      local_1e50 = (XprTypeNested)
                   Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                             ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_1138);
      PVar784 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>>::operator*
                          ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>> *)
                           &local_1e50,
                           (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&numSolutions);
      local_1e48 = PVar784;
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
      ::operator*(&local_1e38,
                  (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                   *)&local_1e48,
                  (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                  (TL.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array + 0x23));
      Eigen::Matrix<double,4,4,0,4,4>::operator=
                ((Matrix<double,4,4,0,4,4> *)&numSolutions,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                  *)&local_1e38);
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&numSolutions);
    }
    iter._3_1_ = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&s);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~vector((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
               *)local_1070);
    return __return_storage_ptr__;
  }
  this_20 = std::operator<<((ostream *)&std::cerr,
                            "Solver 3L1Q requires at least 1 plane, and 3 line pairs!");
  std::ostream::operator<<(this_20,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1P3L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{

	// check input vectors size
	if(plPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 plane, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu, P11, P12, Q11, Q12, P21, P22, Q21, Q22, P31, P32, Q31, Q32;
	Pi = plPair[0].first; Nu = plPair[0].second;

	P11 = lPair[0].first.first; P12 = lPair[0].first.second;
	Q11 = lPair[0].second.first; Q12 = lPair[0].second.second;
	P21 = lPair[1].first.first; P22 = lPair[1].first.second;
	Q21 = lPair[1].second.first; Q22 = lPair[1].second.second;
	P31 = lPair[2].first.first; P32 = lPair[2].first.second;
	Q31 = lPair[2].second.first; Q32 = lPair[2].second.second;

	bool verbose = false;

	Matrix<floatPrec, 3, 1> tP11, tP12, tQ11, tQ12;
	Matrix<floatPrec, 3, 1> tP21, tP22, tQ21, tQ22;
	Matrix<floatPrec, 3, 1> tP31, tP32, tQ31, tQ32;
	tP11 = P11.head(3) / P11(3);
	tP12 = P12.head(3) / P12(3);
	tQ11 = Q11.head(3) / Q11(3);
	tQ12 = Q12.head(3) / Q12(3);
	tP21 = P21.head(3) / P21(3);
	tP22 = P22.head(3) / P22(3);
	tQ21 = Q21.head(3) / Q21(3);
	tQ22 = Q22.head(3) / Q22(3);
	tP31 = P31.head(3) / P31(3);
	tP32 = P32.head(3) / P32(3);
	tQ31 = Q31.head(3) / Q31(3);
	tQ32 = Q32.head(3) / Q32(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3, 1> D1;
	Matrix<floatPrec, 6, 1> L11;
	Matrix<floatPrec, 6, 1> L21;
	Matrix<floatPrec, 6, 1> L31;

	D1 = tP12 - tP11;
	L11.head(3) = D1;
	L11.tail(3) = tP12.cross(tP11);
	L11 /= L11.head(3).norm();
	D1 = tP22 - tP21;
	L21.head(3) = D1;
	L21.tail(3) = tP22.cross(tP21);
	L21 /= L21.head(3).norm();
	D1 = tP32 - tP31;
	L31.head(3) = D1;
	L31.tail(3) = tP32.cross(tP31);
	L31 /= L31.head(3).norm();

	// starting from line 2
	Matrix<floatPrec, 6, 1> L12;
	Matrix<floatPrec, 6, 1> L22;
	Matrix<floatPrec, 6, 1> L32;
	D1 = tQ12 - tQ11;
	L12.head(3) = D1;
	L12.tail(3) = tQ12.cross(tQ11);
	L12 /= L12.head(3).norm();
	D1 = tQ22 - tQ21;
	L22.head(3) = D1;
	L22.tail(3) = tQ22.cross(tQ21);
	L22 /= L22.head(3).norm();
	D1 = tQ32 - tQ31;
	L32.head(3) = D1;
	L32.tail(3) = tQ32.cross(tQ31);
	L32 /= L32.head(3).norm();

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU = predTrans.back();
	predTrans.pop_back();

	if (verbose)
		cout << "[VERBOSE] Matrix TU" << endl
			 << TU << endl;
	if (verbose)
		cout << "[VERBOSE] Matrix TV" << endl
			 << TV << endl;

	// define the transformation to the lines
	Matrix<floatPrec, 6, 6> TL, TK;
	TL = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TL.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TL" << endl
			 << TL << endl;

	TK = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TK.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TK" << endl
			 << TK << endl;

	// apply predefined transformations to the lines
	// get the coefficients
	// get parameters of the first line correspondence
	Matrix<floatPrec, 6, 1> u1;
	floatPrec u11, u12, u13, u14, u15, u16;
	u1 = TL * L11;
	u11 = u1(0);
	u12 = u1(1);
	u13 = u1(2);
	u14 = u1(3);
	u15 = u1(4);
	u16 = u1(5);
	Matrix<floatPrec, 6, 1> v1;
	floatPrec v11, v12, v13, v14, v15, v16;
	v1 = TK * L12;
	v11 = v1(0);
	v12 = v1(1);
	v13 = v1(2);
	v14 = v1(3);
	v15 = v1(4);
	v16 = v1(5);

	// get the parameters of the secod line correspondence
	Matrix<floatPrec, 6, 1> u2;
	floatPrec u21, u22, u23, u24, u25, u26;
	u2 = TL * L21;
	u21 = u2(0);
	u22 = u2(1);
	u23 = u2(2);
	u24 = u2(3);
	u25 = u2(4);
	u26 = u2(5);

	Matrix<floatPrec, 6, 1> v2;
	floatPrec v21, v22, v23, v24, v25, v26;
	v2 = TK * L22;
	v21 = v2(0);
	v22 = v2(1);
	v23 = v2(2);
	v24 = v2(3);
	v25 = v2(4);
	v26 = v2(5);

	// get the parameters of the third line correspondence
	Matrix<floatPrec, 6, 1> u3;
	floatPrec u31, u32, u33, u34, u35, u36;
	u3 = TL * L31;
	u31 = u3(0);
	u32 = u3(1);
	u33 = u3(2);
	u34 = u3(3);
	u35 = u3(4);
	u36 = u3(5);

	Matrix<floatPrec, 6, 1> v3;
	floatPrec v31, v32, v33, v34, v35, v36;
	v3 = TK * L32;
	v31 = v3(0);
	v32 = v3(1);
	v33 = v3(2);
	v34 = v3(3);
	v35 = v3(4);
	v36 = v3(5);

	// compute the coefficients
	floatPrec c1, c2, c3, c4, c5;
	c1 = u11*u21*u32*v13*v24*v33 - u11*u21*u32*v14*v23*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 - u11*u22*u31*v13*v23*v34 + u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 - u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 - u11*u23*u33*v14*v21*v32 + u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 + u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 + u12*u21*u31*v13*v23*v34 - u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 + u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 - u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 + u13*u21*u33*v11*v24*v32 - u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 - u13*u23*u31*v11*v22*v34 + u13*u23*u31*v12*v21*v34 - u13*u23*u34*v11*v22*v31 + u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 + u13*u24*u33*v11*v21*v32 - u13*u24*u33*v12*v21*v31 - u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 + u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 - u14*u23*u33*v11*v21*v32 + u14*u23*u33*v11*v22*v31 - u11*u22*u32*v13*v23*v35 + u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 - u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 + u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 + u12*u21*u32*v13*v23*v35 - u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 + u12*u21*u35*v13*v23*v32 - u12*u22*u31*v13*v25*v33 + u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 - u12*u23*u33*v15*v21*v32 + u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 - u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 + u13*u22*u33*v11*v25*v32 - u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 - u13*u23*u32*v11*v22*v35 + u13*u23*u32*v12*v21*v35 - u13*u23*u35*v11*v22*v32 + u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 + u13*u25*u33*v11*v22*v32 - u13*u25*u33*v12*v22*v31 - u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 + u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 - u15*u23*u33*v12*v21*v32 + u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 + u11*u23*u33*v13*v22*v36 - u11*u23*u33*v13*v26*v32 + u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 - u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 - u12*u23*u33*v13*v21*v36 + u12*u23*u33*v13*v26*v31 - u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 + u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 - u13*u21*u33*v12*v23*v36 + u13*u21*u33*v16*v23*v32 - u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 + u13*u22*u33*v11*v23*v36 - u13*u22*u33*v16*v23*v31 + u13*u22*u36*v11*v23*v33 + u13*u23*u31*v12*v26*v33 - u13*u23*u31*v16*v22*v33 - u13*u23*u32*v11*v26*v33 + u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 + u13*u26*u31*v12*v23*v33 - u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 + u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 - u16*u22*u33*v13*v23*v31 - u16*u23*u31*v13*v22*v33 + u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;
	c2 = 2*u11*u21*u33*v13*v24*v31 - 2*u11*u21*u33*v14*v23*v31 - 2*u11*u23*u31*v13*v21*v34 + 2*u11*u23*u31*v14*v21*v33 - 2*u11*u23*u34*v13*v21*v31 + 2*u11*u24*u33*v13*v21*v31 + 2*u13*u21*u31*v11*v23*v34 - 2*u13*u21*u31*v11*v24*v33 + 2*u13*u21*u34*v11*v23*v31 - 2*u13*u24*u31*v11*v21*v33 - 2*u14*u21*u33*v11*v23*v31 + 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 - 2*u11*u21*u33*v13*v25*v32 + 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 + 2*u11*u22*u33*v13*v24*v32 + 2*u11*u22*u33*v13*v25*v31 - 2*u11*u22*u33*v14*v23*v32 - 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 + 2*u11*u23*u31*v13*v22*v35 - 2*u11*u23*u31*v15*v22*v33 - 2*u11*u23*u32*v13*v21*v35 - 2*u11*u23*u32*v13*v22*v34 + 2*u11*u23*u32*v14*v22*v33 + 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 + 2*u11*u23*u34*v13*v22*v32 - 2*u11*u23*u35*v13*v21*v32 - 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 - 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 + 2*u11*u25*u33*v13*v21*v32 + 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 + 2*u12*u21*u33*v13*v24*v32 + 2*u12*u21*u33*v13*v25*v31 - 2*u12*u21*u33*v14*v23*v32 - 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 - 2*u12*u22*u33*v13*v24*v31 + 2*u12*u22*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v35 - 2*u12*u23*u31*v13*v22*v34 + 2*u12*u23*u31*v14*v22*v33 + 2*u12*u23*u31*v15*v21*v33 + 2*u12*u23*u32*v13*v21*v34 - 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 - 2*u12*u23*u34*v13*v21*v32 - 2*u12*u23*u34*v13*v22*v31 + 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 + 2*u12*u24*u33*v13*v21*v32 + 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 - 2*u12*u25*u33*v13*v21*v31 - 2*u13*u21*u31*v12*v23*v35 + 2*u13*u21*u31*v12*v25*v33 + 2*u13*u21*u32*v11*v23*v35 - 2*u13*u21*u32*v11*v25*v33 + 2*u13*u21*u32*v12*v23*v34 - 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 - 2*u13*u21*u34*v12*v23*v32 + 2*u13*u21*u35*v11*v23*v32 + 2*u13*u21*u35*v12*v23*v31 + 2*u13*u22*u31*v11*v23*v35 - 2*u13*u22*u31*v11*v25*v33 + 2*u13*u22*u31*v12*v23*v34 - 2*u13*u22*u31*v12*v24*v33 - 2*u13*u22*u32*v11*v23*v34 + 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 + 2*u13*u22*u34*v11*v23*v32 + 2*u13*u22*u34*v12*v23*v31 - 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 + 2*u13*u24*u31*v12*v22*v33 - 2*u13*u24*u32*v11*v22*v33 - 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 - 2*u13*u25*u31*v11*v22*v33 - 2*u13*u25*u31*v12*v21*v33 + 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 + 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 - 2*u14*u22*u33*v11*v23*v32 - 2*u14*u22*u33*v12*v23*v31 - 2*u14*u23*u31*v12*v22*v33 + 2*u14*u23*u32*v11*v22*v33 + 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 - 2*u15*u21*u33*v11*v23*v32 - 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 + 2*u15*u22*u33*v11*v23*v31 + 2*u15*u23*u31*v11*v22*v33 + 2*u15*u23*u31*v12*v21*v33 - 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 + 2*u12*u22*u33*v13*v25*v32 - 2*u12*u22*u33*v15*v23*v32 - 2*u12*u23*u32*v13*v22*v35 + 2*u12*u23*u32*v15*v22*v33 - 2*u12*u23*u35*v13*v22*v32 + 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 + 2*u13*u22*u32*v12*v23*v35 - 2*u13*u22*u32*v12*v25*v33 + 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 - 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 - 2*u15*u22*u33*v12*v23*v32 + 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c3 = 2*u11*u21*u33*v14*v23*v32 - 4*u11*u21*u33*v13*v25*v31 - 2*u11*u21*u33*v13*v24*v32 + 4*u11*u21*u33*v15*v23*v31 + 4*u11*u22*u33*v13*v24*v31 - 2*u11*u22*u33*v14*v23*v31 + 4*u11*u23*u31*v13*v21*v35 + 2*u11*u23*u31*v13*v22*v34 - 2*u11*u23*u31*v14*v22*v33 - 4*u11*u23*u31*v15*v21*v33 - 4*u11*u23*u32*v13*v21*v34 + 2*u11*u23*u32*v14*v21*v33 + 4*u11*u23*u34*v13*v21*v32 + 2*u11*u23*u34*v13*v22*v31 - 4*u11*u23*u35*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v32 - 4*u11*u24*u33*v13*v22*v31 + 4*u11*u25*u33*v13*v21*v31 + 2*u12*u21*u33*v13*v24*v31 - 4*u12*u21*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v34 + 4*u12*u23*u31*v14*v21*v33 - 2*u12*u23*u34*v13*v21*v31 + 2*u12*u24*u33*v13*v21*v31 - 4*u13*u21*u31*v11*v23*v35 + 4*u13*u21*u31*v11*v25*v33 - 2*u13*u21*u31*v12*v23*v34 + 2*u13*u21*u31*v12*v24*v33 + 4*u13*u21*u32*v11*v23*v34 - 2*u13*u21*u32*v11*v24*v33 - 4*u13*u21*u34*v11*v23*v32 - 2*u13*u21*u34*v12*v23*v31 + 4*u13*u21*u35*v11*v23*v31 + 2*u13*u22*u31*v11*v23*v34 - 4*u13*u22*u31*v11*v24*v33 + 2*u13*u22*u34*v11*v23*v31 + 4*u13*u24*u31*v11*v22*v33 + 2*u13*u24*u31*v12*v21*v33 - 2*u13*u24*u32*v11*v21*v33 - 4*u13*u25*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v32 + 4*u14*u21*u33*v12*v23*v31 - 2*u14*u22*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v22*v33 - 4*u14*u23*u31*v12*v21*v33 + 2*u14*u23*u32*v11*v21*v33 - 4*u15*u21*u33*v11*v23*v31 + 4*u15*u23*u31*v11*v21*v33 - 2*u11*u22*u33*v13*v25*v32 + 4*u11*u22*u33*v15*v23*v32 + 2*u11*u23*u32*v13*v22*v35 - 4*u11*u23*u32*v15*v22*v33 + 2*u11*u23*u35*v13*v22*v32 - 2*u11*u25*u33*v13*v22*v32 - 4*u12*u21*u33*v13*v25*v32 + 2*u12*u21*u33*v15*v23*v32 + 4*u12*u22*u33*v13*v24*v32 + 2*u12*u22*u33*v13*v25*v31 - 4*u12*u22*u33*v14*v23*v32 - 2*u12*u22*u33*v15*v23*v31 + 4*u12*u23*u31*v13*v22*v35 - 2*u12*u23*u31*v15*v22*v33 - 2*u12*u23*u32*v13*v21*v35 - 4*u12*u23*u32*v13*v22*v34 + 4*u12*u23*u32*v14*v22*v33 + 2*u12*u23*u32*v15*v21*v33 + 4*u12*u23*u34*v13*v22*v32 - 2*u12*u23*u35*v13*v21*v32 - 4*u12*u23*u35*v13*v22*v31 - 4*u12*u24*u33*v13*v22*v32 + 4*u12*u25*u33*v13*v21*v32 + 2*u12*u25*u33*v13*v22*v31 - 2*u13*u21*u32*v12*v23*v35 + 4*u13*u21*u32*v12*v25*v33 - 2*u13*u21*u35*v12*v23*v32 - 4*u13*u22*u31*v12*v23*v35 + 2*u13*u22*u31*v12*v25*v33 + 2*u13*u22*u32*v11*v23*v35 - 2*u13*u22*u32*v11*v25*v33 + 4*u13*u22*u32*v12*v23*v34 - 4*u13*u22*u32*v12*v24*v33 - 4*u13*u22*u34*v12*v23*v32 + 2*u13*u22*u35*v11*v23*v32 + 4*u13*u22*u35*v12*v23*v31 + 4*u13*u24*u32*v12*v22*v33 + 2*u13*u25*u31*v12*v22*v33 - 2*u13*u25*u32*v11*v22*v33 - 4*u13*u25*u32*v12*v21*v33 + 4*u14*u22*u33*v12*v23*v32 - 4*u14*u23*u32*v12*v22*v33 + 2*u15*u21*u33*v12*v23*v32 - 4*u15*u22*u33*v11*v23*v32 - 2*u15*u22*u33*v12*v23*v31 - 2*u15*u23*u31*v12*v22*v33 + 4*u15*u23*u32*v11*v22*v33 + 2*u15*u23*u32*v12*v21*v33 + 2*u11*u22*u33*v13*v23*v36 + 2*u11*u22*u36*v13*v23*v33 - 2*u11*u23*u32*v13*v26*v33 - 2*u11*u26*u32*v13*v23*v33 - 2*u12*u21*u33*v13*v23*v36 - 2*u12*u21*u36*v13*v23*v33 + 2*u12*u23*u31*v13*v26*v33 + 2*u12*u26*u31*v13*v23*v33 + 2*u13*u21*u32*v16*v23*v33 - 2*u13*u22*u31*v16*v23*v33 + 2*u13*u23*u33*v11*v22*v36 - 2*u13*u23*u33*v11*v26*v32 - 2*u13*u23*u33*v12*v21*v36 + 2*u13*u23*u33*v12*v26*v31 + 2*u13*u23*u33*v16*v21*v32 - 2*u13*u23*u33*v16*v22*v31 + 2*u13*u23*u36*v11*v22*v33 - 2*u13*u23*u36*v12*v21*v33 - 2*u13*u26*u33*v11*v23*v32 + 2*u13*u26*u33*v12*v23*v31 + 2*u16*u21*u32*v13*v23*v33 - 2*u16*u22*u31*v13*v23*v33 + 2*u16*u23*u33*v13*v21*v32 - 2*u16*u23*u33*v13*v22*v31;
	c4 = 2*u11*u21*u33*v14*v23*v31 - 2*u11*u21*u33*v13*v24*v31 + 2*u11*u23*u31*v13*v21*v34 - 2*u11*u23*u31*v14*v21*v33 + 2*u11*u23*u34*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v31 - 2*u13*u21*u31*v11*v23*v34 + 2*u13*u21*u31*v11*v24*v33 - 2*u13*u21*u34*v11*v23*v31 + 2*u13*u24*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 + 2*u11*u21*u33*v13*v25*v32 - 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 - 2*u11*u22*u33*v13*v24*v32 - 2*u11*u22*u33*v13*v25*v31 + 2*u11*u22*u33*v14*v23*v32 + 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 - 2*u11*u23*u31*v13*v22*v35 + 2*u11*u23*u31*v15*v22*v33 + 2*u11*u23*u32*v13*v21*v35 + 2*u11*u23*u32*v13*v22*v34 - 2*u11*u23*u32*v14*v22*v33 - 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 - 2*u11*u23*u34*v13*v22*v32 + 2*u11*u23*u35*v13*v21*v32 + 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 + 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 - 2*u11*u25*u33*v13*v21*v32 - 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 - 2*u12*u21*u33*v13*v24*v32 - 2*u12*u21*u33*v13*v25*v31 + 2*u12*u21*u33*v14*v23*v32 + 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 + 2*u12*u22*u33*v13*v24*v31 - 2*u12*u22*u33*v14*v23*v31 + 2*u12*u23*u31*v13*v21*v35 + 2*u12*u23*u31*v13*v22*v34 - 2*u12*u23*u31*v14*v22*v33 - 2*u12*u23*u31*v15*v21*v33 - 2*u12*u23*u32*v13*v21*v34 + 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 + 2*u12*u23*u34*v13*v21*v32 + 2*u12*u23*u34*v13*v22*v31 - 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 - 2*u12*u24*u33*v13*v21*v32 - 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 + 2*u12*u25*u33*v13*v21*v31 + 2*u13*u21*u31*v12*v23*v35 - 2*u13*u21*u31*v12*v25*v33 - 2*u13*u21*u32*v11*v23*v35 + 2*u13*u21*u32*v11*v25*v33 - 2*u13*u21*u32*v12*v23*v34 + 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 + 2*u13*u21*u34*v12*v23*v32 - 2*u13*u21*u35*v11*v23*v32 - 2*u13*u21*u35*v12*v23*v31 - 2*u13*u22*u31*v11*v23*v35 + 2*u13*u22*u31*v11*v25*v33 - 2*u13*u22*u31*v12*v23*v34 + 2*u13*u22*u31*v12*v24*v33 + 2*u13*u22*u32*v11*v23*v34 - 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 - 2*u13*u22*u34*v11*v23*v32 - 2*u13*u22*u34*v12*v23*v31 + 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 - 2*u13*u24*u31*v12*v22*v33 + 2*u13*u24*u32*v11*v22*v33 + 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 + 2*u13*u25*u31*v11*v22*v33 + 2*u13*u25*u31*v12*v21*v33 - 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 - 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 + 2*u14*u22*u33*v11*v23*v32 + 2*u14*u22*u33*v12*v23*v31 + 2*u14*u23*u31*v12*v22*v33 - 2*u14*u23*u32*v11*v22*v33 - 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 + 2*u15*u21*u33*v11*v23*v32 + 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 - 2*u15*u22*u33*v11*v23*v31 - 2*u15*u23*u31*v11*v22*v33 - 2*u15*u23*u31*v12*v21*v33 + 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 - 2*u12*u22*u33*v13*v25*v32 + 2*u12*u22*u33*v15*v23*v32 + 2*u12*u23*u32*v13*v22*v35 - 2*u12*u23*u32*v15*v22*v33 + 2*u12*u23*u35*v13*v22*v32 - 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 - 2*u13*u22*u32*v12*v23*v35 + 2*u13*u22*u32*v12*v25*v33 - 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 + 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 + 2*u15*u22*u33*v12*v23*v32 - 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c5 = u11*u21*u32*v14*v23*v33 - u11*u21*u32*v13*v24*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 + u11*u22*u31*v13*v23*v34 - u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 + u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 + u11*u23*u33*v14*v21*v32 - u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 - u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 - u12*u21*u31*v13*v23*v34 + u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 - u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 + u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 - u13*u21*u33*v11*v24*v32 + u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 + u13*u23*u31*v11*v22*v34 - u13*u23*u31*v12*v21*v34 + u13*u23*u34*v11*v22*v31 - u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 - u13*u24*u33*v11*v21*v32 + u13*u24*u33*v12*v21*v31 + u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 - u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 + u14*u23*u33*v11*v21*v32 - u14*u23*u33*v11*v22*v31 + u11*u22*u32*v13*v23*v35 - u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 + u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 - u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 - u12*u21*u32*v13*v23*v35 + u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 - u12*u21*u35*v13*v23*v32 + u12*u22*u31*v13*v25*v33 - u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 + u12*u23*u33*v15*v21*v32 - u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 + u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 - u13*u22*u33*v11*v25*v32 + u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 + u13*u23*u32*v11*v22*v35 - u13*u23*u32*v12*v21*v35 + u13*u23*u35*v11*v22*v32 - u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 - u13*u25*u33*v11*v22*v32 + u13*u25*u33*v12*v22*v31 + u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 - u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 + u15*u23*u33*v12*v21*v32 - u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 - u11*u23*u33*v13*v22*v36 + u11*u23*u33*v13*v26*v32 - u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 + u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 + u12*u23*u33*v13*v21*v36 - u12*u23*u33*v13*v26*v31 + u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 - u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 + u13*u21*u33*v12*v23*v36 - u13*u21*u33*v16*v23*v32 + u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 - u13*u22*u33*v11*v23*v36 + u13*u22*u33*v16*v23*v31 - u13*u22*u36*v11*v23*v33 - u13*u23*u31*v12*v26*v33 + u13*u23*u31*v16*v22*v33 + u13*u23*u32*v11*v26*v33 - u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 - u13*u26*u31*v12*v23*v33 + u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 - u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 + u16*u22*u33*v13*v23*v31 + u16*u23*u31*v13*v22*v33 - u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;

	//	std::cerr << "[ERR]: new version working" << std::endl;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = c1;
	factors(1, 0) = c2;
	factors(2, 0) = c3;
	factors(3, 0) = c4;
	factors(4, 0) = c5;
	vector<floatPrec> realRoots = o4_roots(factors);
	if (verbose)
		cout << "[VERBOSE] The number of valid solutions is: " << realRoots.size() << endl;

	// estimate the resulting transformations for each of the roots
	floatPrec s, sTheta1, sTheta2, tx, ty;
	floatPrec a, b, shouldBeZero1, shouldBeZero2;
	Matrix<floatPrec, 4, 4> transOut;
	vector<Matrix<floatPrec, 4, 4>> out;
	unsigned int numSolutions = realRoots.size();
	for (unsigned int iter = 0; iter < numSolutions; iter++)
	{

		// get the cTheta
		s = realRoots.back();
		realRoots.pop_back();

		// get the transformation for sTheta1
        a = (1-s*s) / (1+s*s);
        b = 2*s / (1+s*s);
		
		tx = -(u13 * u23 * v11 * v26 - u13 * u23 * v16 * v21 + u13 * u26 * v11 * v23 - u16 * u23 * v13 * v21 - a * u11 * u23 * v14 * v21 + a * u13 * u21 * v11 * v24 + a * u13 * u24 * v11 * v21 - a * u14 * u23 * v11 * v21 - a * u12 * u23 * v15 * v21 + a * u13 * u22 * v11 * v25 + a * u13 * u25 * v11 * v22 - a * u15 * u23 * v12 * v21 - a * u11 * u23 * v13 * v26 - a * u11 * u26 * v13 * v23 + a * u13 * u21 * v16 * v23 + a * u16 * u21 * v13 * v23 - b * u11 * u23 * v15 * v21 + b * u12 * u23 * v14 * v21 + b * u13 * u21 * v11 * v25 - b * u13 * u22 * v11 * v24 + b * u13 * u24 * v11 * v22 - b * u13 * u25 * v11 * v21 - b * u14 * u23 * v12 * v21 + b * u15 * u23 * v11 * v21 + b * u12 * u23 * v13 * v26 + b * u12 * u26 * v13 * v23 - b * u13 * u22 * v16 * v23 - b * u16 * u22 * v13 * v23 - (a * a) * u11 * u21 * v13 * v24 + (a * a) * u11 * u21 * v14 * v23 - (a * a) * u11 * u24 * v13 * v21 + (a * a) * u14 * u21 * v11 * v23 - (a * a) * u11 * u22 * v13 * v25 - (a * a) * u11 * u25 * v13 * v22 + (a * a) * u12 * u21 * v15 * v23 + (a * a) * u15 * u21 * v12 * v23 - (b * b) * u11 * u22 * v15 * v23 + (b * b) * u12 * u21 * v13 * v25 - (b * b) * u12 * u22 * v13 * v24 + (b * b) * u12 * u22 * v14 * v23 + (b * b) * u12 * u24 * v13 * v22 - (b * b) * u12 * u25 * v13 * v21 - (b * b) * u14 * u22 * v12 * v23 + (b * b) * u15 * u22 * v11 * v23 - a * b * u11 * u21 * v13 * v25 + a * b * u11 * u21 * v15 * v23 + a * b * u11 * u22 * v13 * v24 - a * b * u11 * u22 * v14 * v23 - a * b * u11 * u24 * v13 * v22 + a * b * u11 * u25 * v13 * v21 + a * b * u12 * u21 * v13 * v24 - a * b * u12 * u21 * v14 * v23 + a * b * u12 * u24 * v13 * v21 + a * b * u14 * u21 * v12 * v23 - a * b * u14 * u22 * v11 * v23 - a * b * u15 * u21 * v11 * v23 + a * b * u12 * u22 * v13 * v25 - a * b * u12 * u22 * v15 * v23 + a * b * u12 * u25 * v13 * v22 - a * b * u15 * u22 * v12 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		ty = -(u13 * u23 * v12 * v26 - u13 * u23 * v16 * v22 + u13 * u26 * v12 * v23 - u16 * u23 * v13 * v22 - a * u11 * u23 * v14 * v22 + a * u13 * u21 * v12 * v24 + a * u13 * u24 * v12 * v21 - a * u14 * u23 * v11 * v22 - a * u12 * u23 * v15 * v22 + a * u13 * u22 * v12 * v25 + a * u13 * u25 * v12 * v22 - a * u15 * u23 * v12 * v22 - a * u12 * u23 * v13 * v26 - a * u12 * u26 * v13 * v23 + a * u13 * u22 * v16 * v23 + a * u16 * u22 * v13 * v23 - b * u11 * u23 * v15 * v22 + b * u12 * u23 * v14 * v22 + b * u13 * u21 * v12 * v25 - b * u13 * u22 * v12 * v24 + b * u13 * u24 * v12 * v22 - b * u13 * u25 * v12 * v21 - b * u14 * u23 * v12 * v22 + b * u15 * u23 * v11 * v22 - b * u11 * u23 * v13 * v26 - b * u11 * u26 * v13 * v23 + b * u13 * u21 * v16 * v23 + b * u16 * u21 * v13 * v23 + (a * a) * u11 * u22 * v14 * v23 - (a * a) * u12 * u21 * v13 * v24 - (a * a) * u12 * u24 * v13 * v21 + (a * a) * u14 * u22 * v11 * v23 - (a * a) * u12 * u22 * v13 * v25 + (a * a) * u12 * u22 * v15 * v23 - (a * a) * u12 * u25 * v13 * v22 + (a * a) * u15 * u22 * v12 * v23 - (b * b) * u11 * u21 * v13 * v25 + (b * b) * u11 * u21 * v15 * v23 + (b * b) * u11 * u22 * v13 * v24 - (b * b) * u11 * u24 * v13 * v22 + (b * b) * u11 * u25 * v13 * v21 - (b * b) * u12 * u21 * v14 * v23 + (b * b) * u14 * u21 * v12 * v23 - (b * b) * u15 * u21 * v11 * v23 - a * b * u11 * u21 * v13 * v24 + a * b * u11 * u21 * v14 * v23 - a * b * u11 * u24 * v13 * v21 + a * b * u14 * u21 * v11 * v23 - a * b * u11 * u22 * v13 * v25 + a * b * u11 * u22 * v15 * v23 - a * b * u11 * u25 * v13 * v22 - a * b * u12 * u21 * v13 * v25 + a * b * u12 * u21 * v15 * v23 + a * b * u12 * u22 * v13 * v24 - a * b * u12 * u22 * v14 * v23 - a * b * u12 * u24 * v13 * v22 + a * b * u12 * u25 * v13 * v21 + a * b * u14 * u22 * v12 * v23 + a * b * u15 * u21 * v12 * v23 - a * b * u15 * u22 * v11 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		
		transOut << a, -b, 0, tx,
			b, a, 0, ty,
			0, 0, 1, 0,
			0, 0, 0, 1;
		transOut = TV.inverse() * transOut * TU;
		
		// push the valid transformation to the Output
		out.push_back(transOut);
		if (verbose)
			cout << "[VERBOSE] The estimated " << iter + 1 << " solution is:" << endl
				 << transOut << endl;
	}

	return out;
}